

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  uint uVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar71;
  byte bVar72;
  uint uVar73;
  ulong uVar74;
  long lVar75;
  float fVar76;
  vint4 bi_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined4 uVar77;
  undefined1 auVar89 [16];
  undefined1 auVar93 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [56];
  float fVar119;
  float fVar134;
  float fVar135;
  vint4 bi;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar136;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar157;
  float fVar158;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar159;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar196;
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar197;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar198;
  float fVar199;
  undefined8 uVar200;
  float fVar220;
  vint4 ai;
  float fVar218;
  float fVar221;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar210 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar219;
  undefined1 auVar217 [32];
  float fVar225;
  float fVar241;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar250 [16];
  undefined1 auVar263 [32];
  float fVar264;
  float fVar275;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  float fVar276;
  float fVar286;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar318 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar337;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_7a0 [8];
  float fStack_798;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float local_6e0;
  float fStack_6dc;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar70;
  undefined1 auVar118 [64];
  undefined1 auVar154 [32];
  
  PVar6 = prim[1];
  uVar69 = (ulong)(byte)PVar6;
  lVar71 = uVar69 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar76 = *(float *)(prim + lVar71 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar71 + 6));
  auVar78._0_4_ = fVar76 * auVar15._0_4_;
  auVar78._4_4_ = fVar76 * auVar15._4_4_;
  auVar78._8_4_ = fVar76 * auVar15._8_4_;
  auVar78._12_4_ = fVar76 * auVar15._12_4_;
  auVar102._0_4_ = fVar76 * auVar16._0_4_;
  auVar102._4_4_ = fVar76 * auVar16._4_4_;
  auVar102._8_4_ = fVar76 * auVar16._8_4_;
  auVar102._12_4_ = fVar76 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar69 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar328._4_4_ = auVar102._0_4_;
  auVar328._0_4_ = auVar102._0_4_;
  auVar328._8_4_ = auVar102._0_4_;
  auVar328._12_4_ = auVar102._0_4_;
  auVar23 = vshufps_avx(auVar102,auVar102,0x55);
  auVar24 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar76 = auVar24._0_4_;
  auVar277._0_4_ = fVar76 * auVar17._0_4_;
  fVar180 = auVar24._4_4_;
  auVar277._4_4_ = fVar180 * auVar17._4_4_;
  fVar196 = auVar24._8_4_;
  auVar277._8_4_ = fVar196 * auVar17._8_4_;
  fVar139 = auVar24._12_4_;
  auVar277._12_4_ = fVar139 * auVar17._12_4_;
  auVar265._0_4_ = auVar20._0_4_ * fVar76;
  auVar265._4_4_ = auVar20._4_4_ * fVar180;
  auVar265._8_4_ = auVar20._8_4_ * fVar196;
  auVar265._12_4_ = auVar20._12_4_ * fVar139;
  auVar242._0_4_ = auVar22._0_4_ * fVar76;
  auVar242._4_4_ = auVar22._4_4_ * fVar180;
  auVar242._8_4_ = auVar22._8_4_ * fVar196;
  auVar242._12_4_ = auVar22._12_4_ * fVar139;
  auVar24 = vfmadd231ps_fma(auVar277,auVar23,auVar16);
  auVar248 = vfmadd231ps_fma(auVar265,auVar23,auVar19);
  auVar23 = vfmadd231ps_fma(auVar242,auVar161,auVar23);
  auVar80 = vfmadd231ps_fma(auVar24,auVar328,auVar15);
  auVar248 = vfmadd231ps_fma(auVar248,auVar328,auVar18);
  auVar81 = vfmadd231ps_fma(auVar23,auVar21,auVar328);
  auVar329._4_4_ = auVar78._0_4_;
  auVar329._0_4_ = auVar78._0_4_;
  auVar329._8_4_ = auVar78._0_4_;
  auVar329._12_4_ = auVar78._0_4_;
  auVar23 = vshufps_avx(auVar78,auVar78,0x55);
  auVar24 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar76 = auVar24._0_4_;
  auVar120._0_4_ = fVar76 * auVar17._0_4_;
  fVar180 = auVar24._4_4_;
  auVar120._4_4_ = fVar180 * auVar17._4_4_;
  fVar196 = auVar24._8_4_;
  auVar120._8_4_ = fVar196 * auVar17._8_4_;
  fVar139 = auVar24._12_4_;
  auVar120._12_4_ = fVar139 * auVar17._12_4_;
  auVar94._0_4_ = auVar20._0_4_ * fVar76;
  auVar94._4_4_ = auVar20._4_4_ * fVar180;
  auVar94._8_4_ = auVar20._8_4_ * fVar196;
  auVar94._12_4_ = auVar20._12_4_ * fVar139;
  auVar79._0_4_ = auVar22._0_4_ * fVar76;
  auVar79._4_4_ = auVar22._4_4_ * fVar180;
  auVar79._8_4_ = auVar22._8_4_ * fVar196;
  auVar79._12_4_ = auVar22._12_4_ * fVar139;
  auVar16 = vfmadd231ps_fma(auVar120,auVar23,auVar16);
  auVar17 = vfmadd231ps_fma(auVar94,auVar23,auVar19);
  auVar19 = vfmadd231ps_fma(auVar79,auVar23,auVar161);
  auVar94 = vfmadd231ps_fma(auVar16,auVar329,auVar15);
  auVar95 = vfmadd231ps_fma(auVar17,auVar329,auVar18);
  auVar338._8_4_ = 0x7fffffff;
  auVar338._0_8_ = 0x7fffffff7fffffff;
  auVar338._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar80,auVar338);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar226,1);
  auVar16 = vblendvps_avx(auVar80,auVar226,auVar15);
  auVar15 = vandps_avx(auVar248,auVar338);
  auVar15 = vcmpps_avx(auVar15,auVar226,1);
  auVar17 = vblendvps_avx(auVar248,auVar226,auVar15);
  auVar15 = vandps_avx(auVar81,auVar338);
  auVar15 = vcmpps_avx(auVar15,auVar226,1);
  auVar15 = vblendvps_avx(auVar81,auVar226,auVar15);
  auVar96 = vfmadd231ps_fma(auVar19,auVar329,auVar21);
  auVar18 = vrcpps_avx(auVar16);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = &DAT_3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar227);
  auVar80 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar227);
  auVar81 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar227);
  auVar78 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar76 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar71 + 0x16)) *
           *(float *)(prim + lVar71 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar171._4_4_ = fVar76;
  auVar171._0_4_ = fVar76;
  auVar171._8_4_ = fVar76;
  auVar171._12_4_ = fVar76;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar79 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar17 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  uVar74 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar74 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar161);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar19 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar23);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar20 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar69) + 6);
  auVar15 = vpmovsxwd_avx(auVar24);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar248);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar171,auVar15);
  auVar15 = vsubps_avx(auVar79,auVar94);
  auVar191._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar191._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar191._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar191._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar94);
  auVar253._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar253._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar253._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar253._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar95);
  auVar181._0_4_ = auVar81._0_4_ * auVar15._0_4_;
  auVar181._4_4_ = auVar81._4_4_ * auVar15._4_4_;
  auVar181._8_4_ = auVar81._8_4_ * auVar15._8_4_;
  auVar181._12_4_ = auVar81._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar19,auVar95);
  auVar95._0_4_ = auVar81._0_4_ * auVar15._0_4_;
  auVar95._4_4_ = auVar81._4_4_ * auVar15._4_4_;
  auVar95._8_4_ = auVar81._8_4_ * auVar15._8_4_;
  auVar95._12_4_ = auVar81._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar20,auVar96);
  auVar160._0_4_ = auVar78._0_4_ * auVar15._0_4_;
  auVar160._4_4_ = auVar78._4_4_ * auVar15._4_4_;
  auVar160._8_4_ = auVar78._8_4_ * auVar15._8_4_;
  auVar160._12_4_ = auVar78._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar96);
  auVar80._0_4_ = auVar78._0_4_ * auVar15._0_4_;
  auVar80._4_4_ = auVar78._4_4_ * auVar15._4_4_;
  auVar80._8_4_ = auVar78._8_4_ * auVar15._8_4_;
  auVar80._12_4_ = auVar78._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar191,auVar253);
  auVar16 = vpminsd_avx(auVar181,auVar95);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar160,auVar80);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar243._4_4_ = uVar77;
  auVar243._0_4_ = uVar77;
  auVar243._8_4_ = uVar77;
  auVar243._12_4_ = uVar77;
  auVar16 = vmaxps_avx(auVar16,auVar243);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_470._0_4_ = auVar15._0_4_ * 0.99999964;
  local_470._4_4_ = auVar15._4_4_ * 0.99999964;
  local_470._8_4_ = auVar15._8_4_ * 0.99999964;
  local_470._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar191,auVar253);
  auVar16 = vpmaxsd_avx(auVar181,auVar95);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar160,auVar80);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar121._4_4_ = uVar77;
  auVar121._0_4_ = uVar77;
  auVar121._8_4_ = uVar77;
  auVar121._12_4_ = uVar77;
  auVar16 = vminps_avx(auVar16,auVar121);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar81._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar6;
  auVar96[4] = PVar6;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar6;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar6;
  auVar96._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar96,_DAT_01ff0cf0);
  auVar15 = vcmpps_avx(local_470,auVar81,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar64 = vmovmskps_avx(auVar15);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  iVar65 = 1 << ((uint)k & 0x1f);
  auVar92._4_4_ = iVar65;
  auVar92._0_4_ = iVar65;
  auVar92._8_4_ = iVar65;
  auVar92._12_4_ = iVar65;
  auVar92._16_4_ = iVar65;
  auVar92._20_4_ = iVar65;
  auVar92._24_4_ = iVar65;
  auVar92._28_4_ = iVar65;
  auVar26 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar91 = vpand_avx2(auVar92,auVar26);
  local_360 = vpcmpeqd_avx2(auVar91,auVar26);
LAB_0179164c:
  lVar71 = 0;
  for (uVar69 = (ulong)uVar64; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar68 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar71 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar68].ptr;
  fVar76 = (pGVar8->time_range).lower;
  fVar196 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar76) / ((pGVar8->time_range).upper - fVar76));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar23 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar23._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar75);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar75);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar69);
  lVar71 = uVar69 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar71);
  lVar1 = uVar69 + 2;
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar69 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar62 = *pauVar3;
  fVar76 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar75);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar75);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar69);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar71);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar180 = *pfVar4;
  fVar139 = pfVar4[1];
  fVar197 = pfVar4[2];
  fVar138 = pfVar4[3];
  auVar102 = ZEXT816(0) << 0x40;
  auVar302._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar302._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar302._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar302._12_4_ = fVar76 * 0.0;
  auVar244._8_4_ = 0x3e2aaaab;
  auVar244._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar244._12_4_ = 0x3e2aaaab;
  auVar80 = vfmadd213ps_fma(auVar244,auVar17,auVar302);
  auVar314._8_4_ = 0x3f000000;
  auVar314._0_8_ = 0x3f0000003f000000;
  auVar314._12_4_ = 0x3f000000;
  auVar21 = vfmadd231ps_fma(auVar302,auVar17,auVar314);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar16,auVar102);
  auVar253 = vfnmadd231ps_fma(auVar21,auVar15,auVar314);
  auVar182._0_4_ = fVar180 * 0.0;
  auVar182._4_4_ = fVar139 * 0.0;
  auVar182._8_4_ = fVar197 * 0.0;
  auVar182._12_4_ = fVar138 * 0.0;
  auVar21 = vfmadd213ps_fma(auVar244,auVar20,auVar182);
  auVar140._8_4_ = 0x3f2aaaab;
  auVar140._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar140._12_4_ = 0x3f2aaaab;
  auVar21 = vfmadd231ps_fma(auVar21,auVar19,auVar140);
  auVar21 = vfmadd231ps_fma(auVar21,auVar18,auVar244);
  auVar161 = vfmadd231ps_fma(auVar182,auVar20,auVar314);
  auVar161 = vfnmadd231ps_fma(auVar161,auVar19,auVar102);
  auVar22 = vfnmadd231ps_fma(auVar161,auVar18,auVar314);
  auVar330._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar330._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar330._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar330._12_4_ = fVar76 * 0.5;
  auVar161 = vfmadd231ps_fma(auVar330,auVar102,auVar17);
  auVar161 = vfnmadd231ps_fma(auVar161,auVar314,auVar16);
  auVar121 = vfnmadd231ps_fma(auVar161,auVar102,auVar15);
  auVar266._0_4_ = fVar180 * 0.16666667;
  auVar266._4_4_ = fVar139 * 0.16666667;
  auVar266._8_4_ = fVar197 * 0.16666667;
  auVar266._12_4_ = fVar138 * 0.16666667;
  auVar161 = vfmadd231ps_fma(auVar266,auVar20,auVar140);
  auVar161 = vfmadd231ps_fma(auVar161,auVar19,auVar244);
  auVar161 = vfmadd231ps_fma(auVar161,auVar18,auVar102);
  auVar228._0_4_ = fVar180 * 0.5;
  auVar228._4_4_ = fVar139 * 0.5;
  auVar228._8_4_ = fVar197 * 0.5;
  auVar228._12_4_ = fVar138 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar228,auVar102,auVar20);
  auVar19 = vfnmadd231ps_fma(auVar20,auVar314,auVar19);
  auVar20 = vfnmadd231ps_fma(auVar19,auVar102,auVar18);
  auVar18 = vshufps_avx(auVar253,auVar253,0xc9);
  auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
  fVar289 = auVar253._0_4_;
  auVar97._0_4_ = fVar289 * auVar19._0_4_;
  fVar224 = auVar253._4_4_;
  auVar97._4_4_ = fVar224 * auVar19._4_4_;
  fVar225 = auVar253._8_4_;
  auVar97._8_4_ = fVar225 * auVar19._8_4_;
  fVar241 = auVar253._12_4_;
  auVar97._12_4_ = fVar241 * auVar19._12_4_;
  auVar78 = vfmsub231ps_fma(auVar97,auVar18,auVar21);
  auVar19 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar98._0_4_ = fVar289 * auVar19._0_4_;
  auVar98._4_4_ = fVar224 * auVar19._4_4_;
  auVar98._8_4_ = fVar225 * auVar19._8_4_;
  auVar98._12_4_ = fVar241 * auVar19._12_4_;
  auVar79 = vfmsub231ps_fma(auVar98,auVar18,auVar22);
  auVar18 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar19 = vshufps_avx(auVar161,auVar161,0xc9);
  fVar264 = auVar121._0_4_;
  auVar99._0_4_ = fVar264 * auVar19._0_4_;
  fVar275 = auVar121._4_4_;
  auVar99._4_4_ = fVar275 * auVar19._4_4_;
  fVar327 = auVar121._8_4_;
  auVar99._8_4_ = fVar327 * auVar19._8_4_;
  fVar337 = auVar121._12_4_;
  auVar99._12_4_ = fVar337 * auVar19._12_4_;
  auVar94 = vfmsub231ps_fma(auVar99,auVar18,auVar161);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar100._0_4_ = fVar264 * auVar19._0_4_;
  auVar100._4_4_ = fVar275 * auVar19._4_4_;
  auVar100._8_4_ = fVar327 * auVar19._8_4_;
  auVar100._12_4_ = fVar337 * auVar19._12_4_;
  auVar95 = vfmsub231ps_fma(auVar100,auVar18,auVar20);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar75);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar75);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar63 = *pauVar3;
  fVar138 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar75);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar75);
  auVar267._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar267._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar267._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar267._12_4_ = fVar138 * 0.0;
  auVar81 = vfmadd213ps_fma(auVar244,auVar18,auVar267);
  auVar20 = vfmadd231ps_fma(auVar267,auVar18,auVar314);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar71);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar19,auVar102);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar69);
  auVar160 = vfnmadd231ps_fma(auVar21,auVar20,auVar314);
  auVar21 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar180 = *pfVar4;
  fVar139 = pfVar4[1];
  fVar197 = pfVar4[2];
  fVar119 = pfVar4[3];
  auVar82._0_4_ = fVar180 * 0.0;
  auVar82._4_4_ = fVar139 * 0.0;
  auVar82._8_4_ = fVar197 * 0.0;
  auVar82._12_4_ = fVar119 * 0.0;
  auVar22 = vfmadd213ps_fma(auVar244,auVar21,auVar82);
  auVar161 = *(undefined1 (*) [16])(lVar13 + lVar71 * lVar10);
  auVar101._8_4_ = 0x3f2aaaab;
  auVar101._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar101._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar22,auVar161,auVar101);
  auVar22 = *(undefined1 (*) [16])(lVar13 + uVar69 * lVar10);
  auVar248 = vfmadd231ps_fma(auVar24,auVar22,auVar244);
  auVar24 = vshufps_avx(auVar248,auVar248,0xc9);
  fVar287 = auVar160._0_4_;
  auVar183._0_4_ = fVar287 * auVar24._0_4_;
  fVar222 = auVar160._4_4_;
  auVar183._4_4_ = fVar222 * auVar24._4_4_;
  fVar288 = auVar160._8_4_;
  auVar183._8_4_ = fVar288 * auVar24._8_4_;
  fVar223 = auVar160._12_4_;
  auVar183._12_4_ = fVar223 * auVar24._12_4_;
  auVar24 = vshufps_avx(auVar160,auVar160,0xc9);
  auVar96 = vfmsub231ps_fma(auVar183,auVar24,auVar248);
  auVar248 = vfmadd231ps_fma(auVar82,auVar21,auVar314);
  auVar248 = vfnmadd231ps_fma(auVar248,auVar161,auVar102);
  auVar102 = vfnmadd231ps_fma(auVar248,auVar22,auVar314);
  auVar248 = vshufps_avx(auVar102,auVar102,0xc9);
  auVar184._0_4_ = fVar287 * auVar248._0_4_;
  auVar184._4_4_ = fVar222 * auVar248._4_4_;
  auVar184._8_4_ = fVar288 * auVar248._8_4_;
  auVar184._12_4_ = fVar223 * auVar248._12_4_;
  auVar248 = vfmsub231ps_fma(auVar184,auVar24,auVar102);
  auVar339._8_4_ = 0x3e2aaaab;
  auVar339._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar339._12_4_ = 0x3e2aaaab;
  auVar83._0_4_ = fVar180 * 0.16666667;
  auVar83._4_4_ = fVar139 * 0.16666667;
  auVar83._8_4_ = fVar197 * 0.16666667;
  auVar83._12_4_ = fVar119 * 0.16666667;
  auVar290._8_4_ = 0x3f2aaaab;
  auVar290._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar290._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar83,auVar21,auVar290);
  auVar141._0_4_ = fVar180 * 0.5;
  auVar141._4_4_ = fVar139 * 0.5;
  auVar141._8_4_ = fVar197 * 0.5;
  auVar141._12_4_ = fVar119 * 0.5;
  auVar102 = ZEXT816(0) << 0x20;
  auVar21 = vfmadd231ps_fma(auVar141,auVar102,auVar21);
  auVar24 = vfmadd231ps_fma(auVar24,auVar161,auVar339);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar314,auVar161);
  auVar161 = vfmadd231ps_fma(auVar24,auVar22,auVar102);
  auVar22 = vfnmadd231ps_fma(auVar21,auVar102,auVar22);
  local_7a0._0_4_ = auVar63._0_4_;
  local_7a0._4_4_ = auVar63._4_4_;
  fStack_798 = auVar63._8_4_;
  auVar185._0_4_ = (float)local_7a0._0_4_ * 0.5;
  auVar185._4_4_ = (float)local_7a0._4_4_ * 0.5;
  auVar185._8_4_ = fStack_798 * 0.5;
  auVar185._12_4_ = fVar138 * 0.5;
  auVar21 = vfmadd231ps_fma(auVar185,auVar102,auVar18);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar314,auVar19);
  auVar181 = vfnmadd231ps_fma(auVar21,auVar102,auVar20);
  auVar21 = vshufps_avx(auVar161,auVar161,0xc9);
  fVar276 = auVar181._0_4_;
  auVar103._0_4_ = fVar276 * auVar21._0_4_;
  fVar199 = auVar181._4_4_;
  auVar103._4_4_ = fVar199 * auVar21._4_4_;
  fVar286 = auVar181._8_4_;
  auVar103._8_4_ = fVar286 * auVar21._8_4_;
  fVar219 = auVar181._12_4_;
  auVar103._12_4_ = fVar219 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar181,auVar181,0xc9);
  auVar102 = vfmsub231ps_fma(auVar103,auVar21,auVar161);
  auVar161 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar84._0_4_ = fVar276 * auVar161._0_4_;
  auVar84._4_4_ = fVar199 * auVar161._4_4_;
  auVar84._8_4_ = fVar286 * auVar161._8_4_;
  auVar84._12_4_ = fVar219 * auVar161._12_4_;
  auVar120 = vfmsub231ps_fma(auVar84,auVar21,auVar22);
  fVar196 = fVar196 - auVar23._0_4_;
  local_720._0_4_ = auVar62._0_4_;
  local_720._4_4_ = auVar62._4_4_;
  fStack_718 = auVar62._8_4_;
  auVar104._0_4_ = (float)local_720._0_4_ * 0.16666667;
  auVar104._4_4_ = (float)local_720._4_4_ * 0.16666667;
  auVar104._8_4_ = fStack_718 * 0.16666667;
  auVar104._12_4_ = fVar76 * 0.16666667;
  auVar17 = vfmadd231ps_fma(auVar104,auVar290,auVar17);
  auVar21 = vfmadd231ps_fma(auVar80,auVar16,auVar290);
  auVar161 = vfmadd231ps_fma(auVar17,auVar16,auVar339);
  auVar23 = vfmadd231ps_fma(auVar21,auVar15,auVar339);
  auVar17 = vpermilps_avx(auVar78,0xc9);
  auVar16 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar24 = vfmadd231ps_fma(auVar161,auVar15,ZEXT816(0));
  fVar180 = auVar16._0_4_;
  auVar161 = ZEXT416((uint)fVar180);
  auVar15 = vrsqrtss_avx(auVar161,auVar161);
  fVar76 = auVar15._0_4_;
  fVar76 = fVar180 * -0.5 * fVar76 * fVar76 * fVar76 + fVar76 * 1.5;
  auVar15 = vpermilps_avx(auVar79,0xc9);
  auVar340._0_4_ = fVar180 * auVar15._0_4_;
  auVar340._4_4_ = fVar180 * auVar15._4_4_;
  auVar340._8_4_ = fVar180 * auVar15._8_4_;
  auVar340._12_4_ = fVar180 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar17,auVar15,0x7f);
  fVar180 = auVar15._0_4_;
  auVar245._0_4_ = fVar180 * auVar17._0_4_;
  auVar245._4_4_ = fVar180 * auVar17._4_4_;
  auVar245._8_4_ = fVar180 * auVar17._8_4_;
  auVar245._12_4_ = fVar180 * auVar17._12_4_;
  auVar21 = vsubps_avx(auVar340,auVar245);
  auVar15 = vrcpss_avx(auVar161,auVar161);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar139 = auVar15._0_4_ * auVar16._0_4_;
  fVar119 = auVar17._0_4_ * fVar76;
  fVar134 = auVar17._4_4_ * fVar76;
  fVar135 = auVar17._8_4_ * fVar76;
  fVar136 = auVar17._12_4_ * fVar76;
  auVar161 = vpermilps_avx(auVar94,0xc9);
  auVar16 = vdpps_avx(auVar161,auVar161,0x7f);
  auVar15 = vblendps_avx(auVar16,_DAT_01feba10,0xe);
  auVar17 = vrsqrtss_avx(auVar15,auVar15);
  fVar197 = auVar16._0_4_;
  fVar180 = auVar17._0_4_;
  auVar22 = vpermilps_avx(auVar95,0xc9);
  auVar17 = vdpps_avx(auVar161,auVar22,0x7f);
  fVar180 = fVar180 * 1.5 + fVar180 * fVar180 * fVar180 * fVar197 * -0.5;
  auVar291._0_4_ = fVar197 * auVar22._0_4_;
  auVar291._4_4_ = fVar197 * auVar22._4_4_;
  auVar291._8_4_ = fVar197 * auVar22._8_4_;
  auVar291._12_4_ = fVar197 * auVar22._12_4_;
  fVar197 = auVar17._0_4_;
  auVar85._0_4_ = fVar197 * auVar161._0_4_;
  auVar85._4_4_ = fVar197 * auVar161._4_4_;
  auVar85._8_4_ = fVar197 * auVar161._8_4_;
  auVar85._12_4_ = fVar197 * auVar161._12_4_;
  auVar17 = vsubps_avx(auVar291,auVar85);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar80 = SUB6416(ZEXT464(0x40000000),0);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,auVar80);
  fVar197 = auVar15._0_4_ * auVar16._0_4_;
  fVar137 = auVar161._0_4_ * fVar180;
  fVar157 = auVar161._4_4_ * fVar180;
  fVar158 = auVar161._8_4_ * fVar180;
  fVar159 = auVar161._12_4_ * fVar180;
  auVar15 = vshufps_avx(auVar253,auVar253,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar246._0_4_ = auVar16._0_4_ * fVar119;
  auVar246._4_4_ = auVar16._4_4_ * fVar134;
  auVar246._8_4_ = auVar16._8_4_ * fVar135;
  auVar246._12_4_ = auVar16._12_4_ * fVar136;
  auVar162._0_4_ = auVar15._0_4_ * fVar119 + fVar76 * auVar21._0_4_ * fVar139 * auVar16._0_4_;
  auVar162._4_4_ = auVar15._4_4_ * fVar134 + fVar76 * auVar21._4_4_ * fVar139 * auVar16._4_4_;
  auVar162._8_4_ = auVar15._8_4_ * fVar135 + fVar76 * auVar21._8_4_ * fVar139 * auVar16._8_4_;
  auVar162._12_4_ = auVar15._12_4_ * fVar136 + fVar76 * auVar21._12_4_ * fVar139 * auVar16._12_4_;
  auVar21 = vsubps_avx(auVar23,auVar246);
  fVar198 = auVar246._0_4_ + auVar23._0_4_;
  fVar218 = auVar246._4_4_ + auVar23._4_4_;
  fVar220 = auVar246._8_4_ + auVar23._8_4_;
  fVar221 = auVar246._12_4_ + auVar23._12_4_;
  auVar161 = vsubps_avx(auVar253,auVar162);
  auVar15 = vshufps_avx(auVar121,auVar121,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar142._0_4_ = auVar16._0_4_ * fVar137;
  auVar142._4_4_ = auVar16._4_4_ * fVar157;
  auVar142._8_4_ = auVar16._8_4_ * fVar158;
  auVar142._12_4_ = auVar16._12_4_ * fVar159;
  auVar163._0_4_ = auVar15._0_4_ * fVar137 + auVar16._0_4_ * fVar180 * auVar17._0_4_ * fVar197;
  auVar163._4_4_ = auVar15._4_4_ * fVar157 + auVar16._4_4_ * fVar180 * auVar17._4_4_ * fVar197;
  auVar163._8_4_ = auVar15._8_4_ * fVar158 + auVar16._8_4_ * fVar180 * auVar17._8_4_ * fVar197;
  auVar163._12_4_ = auVar15._12_4_ * fVar159 + auVar16._12_4_ * fVar180 * auVar17._12_4_ * fVar197;
  auVar17 = vsubps_avx(auVar24,auVar142);
  local_720._4_4_ = auVar24._4_4_ + auVar142._4_4_;
  local_720._0_4_ = auVar24._0_4_ + auVar142._0_4_;
  fStack_718 = auVar24._8_4_ + auVar142._8_4_;
  fStack_714 = auVar24._12_4_ + auVar142._12_4_;
  auVar22 = vsubps_avx(auVar121,auVar163);
  auVar86._8_4_ = 0x3e2aaaab;
  auVar86._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar86._12_4_ = 0x3e2aaaab;
  auVar315._0_4_ = (float)local_7a0._0_4_ * 0.16666667;
  auVar315._4_4_ = (float)local_7a0._4_4_ * 0.16666667;
  auVar315._8_4_ = fStack_798 * 0.16666667;
  auVar315._12_4_ = fVar138 * 0.16666667;
  auVar143._8_4_ = 0x3f2aaaab;
  auVar143._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar143._12_4_ = 0x3f2aaaab;
  auVar15 = vfmadd231ps_fma(auVar315,auVar143,auVar18);
  auVar16 = vfmadd231ps_fma(auVar81,auVar19,auVar143);
  auVar18 = vfmadd231ps_fma(auVar15,auVar19,auVar86);
  auVar23 = vfmadd231ps_fma(auVar16,auVar20,auVar86);
  auVar19 = vpermilps_avx(auVar96,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar24 = vfmadd231ps_fma(auVar18,auVar20,ZEXT816(0) << 0x40);
  fVar180 = auVar15._0_4_;
  auVar164._4_12_ = ZEXT812(0) << 0x20;
  auVar164._0_4_ = fVar180;
  auVar16 = vrsqrtss_avx(auVar164,auVar164);
  fVar76 = auVar16._0_4_;
  fVar76 = fVar180 * -0.5 * fVar76 * fVar76 * fVar76 + fVar76 * 1.5;
  auVar16 = vpermilps_avx(auVar248,0xc9);
  auVar278._0_4_ = fVar180 * auVar16._0_4_;
  auVar278._4_4_ = fVar180 * auVar16._4_4_;
  auVar278._8_4_ = fVar180 * auVar16._8_4_;
  auVar278._12_4_ = fVar180 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar19,auVar16,0x7f);
  fVar180 = auVar16._0_4_;
  auVar247._0_4_ = fVar180 * auVar19._0_4_;
  auVar247._4_4_ = fVar180 * auVar19._4_4_;
  auVar247._8_4_ = fVar180 * auVar19._8_4_;
  auVar247._12_4_ = fVar180 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar278,auVar247);
  auVar16 = vrcpss_avx(auVar164,auVar164);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar80);
  fVar139 = auVar16._0_4_ * auVar15._0_4_;
  fVar138 = auVar19._0_4_ * fVar76;
  fVar119 = auVar19._4_4_ * fVar76;
  fVar134 = auVar19._8_4_ * fVar76;
  fVar135 = auVar19._12_4_ * fVar76;
  auVar20 = vpermilps_avx(auVar102,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar197 = auVar15._0_4_;
  auVar248 = ZEXT416((uint)fVar197);
  auVar16 = vrsqrtss_avx(auVar248,auVar248);
  fVar180 = auVar16._0_4_;
  auVar19 = vpermilps_avx(auVar120,0xc9);
  auVar16 = vdpps_avx(auVar20,auVar19,0x7f);
  fVar180 = fVar180 * 1.5 + fVar197 * -0.5 * fVar180 * fVar180 * fVar180;
  auVar292._0_4_ = fVar197 * auVar19._0_4_;
  auVar292._4_4_ = fVar197 * auVar19._4_4_;
  auVar292._8_4_ = fVar197 * auVar19._8_4_;
  auVar292._12_4_ = fVar197 * auVar19._12_4_;
  fVar197 = auVar16._0_4_;
  auVar331._0_4_ = fVar197 * auVar20._0_4_;
  auVar331._4_4_ = fVar197 * auVar20._4_4_;
  auVar331._8_4_ = fVar197 * auVar20._8_4_;
  auVar331._12_4_ = fVar197 * auVar20._12_4_;
  auVar19 = vsubps_avx(auVar292,auVar331);
  auVar16 = vrcpss_avx(auVar248,auVar248);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar80);
  fVar197 = auVar16._0_4_ * auVar15._0_4_;
  fVar136 = fVar180 * auVar20._0_4_;
  fVar137 = fVar180 * auVar20._4_4_;
  fVar157 = fVar180 * auVar20._8_4_;
  fVar158 = fVar180 * auVar20._12_4_;
  auVar15 = vshufps_avx(auVar160,auVar160,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar144._0_4_ = auVar16._0_4_ * fVar138;
  auVar144._4_4_ = auVar16._4_4_ * fVar119;
  auVar144._8_4_ = auVar16._8_4_ * fVar134;
  auVar144._12_4_ = auVar16._12_4_ * fVar135;
  auVar105._0_4_ = auVar15._0_4_ * fVar138 + auVar16._0_4_ * fVar76 * auVar18._0_4_ * fVar139;
  auVar105._4_4_ = auVar15._4_4_ * fVar119 + auVar16._4_4_ * fVar76 * auVar18._4_4_ * fVar139;
  auVar105._8_4_ = auVar15._8_4_ * fVar134 + auVar16._8_4_ * fVar76 * auVar18._8_4_ * fVar139;
  auVar105._12_4_ = auVar15._12_4_ * fVar135 + auVar16._12_4_ * fVar76 * auVar18._12_4_ * fVar139;
  auVar18 = vsubps_avx(auVar23,auVar144);
  fVar139 = auVar23._0_4_ + auVar144._0_4_;
  fVar138 = auVar23._4_4_ + auVar144._4_4_;
  fVar119 = auVar23._8_4_ + auVar144._8_4_;
  fVar134 = auVar23._12_4_ + auVar144._12_4_;
  auVar20 = vsubps_avx(auVar160,auVar105);
  auVar15 = vshufps_avx(auVar181,auVar181,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar165._0_4_ = auVar16._0_4_ * fVar136;
  auVar165._4_4_ = auVar16._4_4_ * fVar137;
  auVar165._8_4_ = auVar16._8_4_ * fVar157;
  auVar165._12_4_ = auVar16._12_4_ * fVar158;
  auVar106._0_4_ = auVar16._0_4_ * fVar180 * auVar19._0_4_ * fVar197 + auVar15._0_4_ * fVar136;
  auVar106._4_4_ = auVar16._4_4_ * fVar180 * auVar19._4_4_ * fVar197 + auVar15._4_4_ * fVar137;
  auVar106._8_4_ = auVar16._8_4_ * fVar180 * auVar19._8_4_ * fVar197 + auVar15._8_4_ * fVar157;
  auVar106._12_4_ = auVar16._12_4_ * fVar180 * auVar19._12_4_ * fVar197 + auVar15._12_4_ * fVar158;
  auVar15 = vsubps_avx(auVar24,auVar165);
  auVar166._0_4_ = auVar24._0_4_ + auVar165._0_4_;
  auVar166._4_4_ = auVar24._4_4_ + auVar165._4_4_;
  auVar166._8_4_ = auVar24._8_4_ + auVar165._8_4_;
  auVar166._12_4_ = auVar24._12_4_ + auVar165._12_4_;
  auVar16 = vsubps_avx(auVar181,auVar106);
  local_6a0 = auVar161._0_4_;
  fStack_69c = auVar161._4_4_;
  fStack_698 = auVar161._8_4_;
  fStack_694 = auVar161._12_4_;
  auVar186._0_4_ = auVar21._0_4_ + local_6a0 * 0.33333334;
  auVar186._4_4_ = auVar21._4_4_ + fStack_69c * 0.33333334;
  auVar186._8_4_ = auVar21._8_4_ + fStack_698 * 0.33333334;
  auVar186._12_4_ = auVar21._12_4_ + fStack_694 * 0.33333334;
  fVar76 = 1.0 - fVar196;
  auVar107._4_4_ = fVar76;
  auVar107._0_4_ = fVar76;
  auVar107._8_4_ = fVar76;
  auVar107._12_4_ = fVar76;
  auVar293._0_4_ = fVar196 * auVar18._0_4_;
  auVar293._4_4_ = fVar196 * auVar18._4_4_;
  auVar293._8_4_ = fVar196 * auVar18._8_4_;
  auVar293._12_4_ = fVar196 * auVar18._12_4_;
  local_4f0 = vfmadd231ps_fma(auVar293,auVar107,auVar21);
  auVar122._0_4_ = fVar196 * (auVar18._0_4_ + auVar20._0_4_ * 0.33333334);
  auVar122._4_4_ = fVar196 * (auVar18._4_4_ + auVar20._4_4_ * 0.33333334);
  auVar122._8_4_ = fVar196 * (auVar18._8_4_ + auVar20._8_4_ * 0.33333334);
  auVar122._12_4_ = fVar196 * (auVar18._12_4_ + auVar20._12_4_ * 0.33333334);
  auVar21 = vfmadd231ps_fma(auVar122,auVar107,auVar186);
  local_730 = auVar22._0_4_;
  fStack_72c = auVar22._4_4_;
  fStack_728 = auVar22._8_4_;
  fStack_724 = auVar22._12_4_;
  auVar123._0_4_ = local_730 * 0.33333334;
  auVar123._4_4_ = fStack_72c * 0.33333334;
  auVar123._8_4_ = fStack_728 * 0.33333334;
  auVar123._12_4_ = fStack_724 * 0.33333334;
  auVar18 = vsubps_avx(auVar17,auVar123);
  auVar54._4_4_ = fVar218;
  auVar54._0_4_ = fVar198;
  auVar54._8_4_ = fVar220;
  auVar54._12_4_ = fVar221;
  auVar316._0_4_ = fVar198 + (fVar289 + auVar162._0_4_) * 0.33333334;
  auVar316._4_4_ = fVar218 + (fVar224 + auVar162._4_4_) * 0.33333334;
  auVar316._8_4_ = fVar220 + (fVar225 + auVar162._8_4_) * 0.33333334;
  auVar316._12_4_ = fVar221 + (fVar241 + auVar162._12_4_) * 0.33333334;
  auVar201._0_4_ = (fVar264 + auVar163._0_4_) * 0.33333334;
  auVar201._4_4_ = (fVar275 + auVar163._4_4_) * 0.33333334;
  auVar201._8_4_ = (fVar327 + auVar163._8_4_) * 0.33333334;
  auVar201._12_4_ = (fVar337 + auVar163._12_4_) * 0.33333334;
  auVar19 = vsubps_avx(_local_720,auVar201);
  auVar294._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar294._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar294._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar294._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar15,auVar294);
  auVar268._0_4_ = (fVar276 + auVar106._0_4_) * 0.33333334;
  auVar268._4_4_ = (fVar199 + auVar106._4_4_) * 0.33333334;
  auVar268._8_4_ = (fVar286 + auVar106._8_4_) * 0.33333334;
  auVar268._12_4_ = (fVar219 + auVar106._12_4_) * 0.33333334;
  auVar20 = vsubps_avx(auVar166,auVar268);
  auVar295._0_4_ = fVar196 * auVar16._0_4_;
  auVar295._4_4_ = fVar196 * auVar16._4_4_;
  auVar295._8_4_ = fVar196 * auVar16._8_4_;
  auVar295._12_4_ = fVar196 * auVar16._12_4_;
  auVar249._0_4_ = fVar196 * auVar15._0_4_;
  auVar249._4_4_ = fVar196 * auVar15._4_4_;
  auVar249._8_4_ = fVar196 * auVar15._8_4_;
  auVar249._12_4_ = fVar196 * auVar15._12_4_;
  local_500 = vfmadd231ps_fma(auVar295,auVar107,auVar18);
  auVar161 = vfmadd231ps_fma(auVar249,auVar107,auVar17);
  auVar124._0_4_ = fVar196 * fVar139;
  auVar124._4_4_ = fVar196 * fVar138;
  auVar124._8_4_ = fVar196 * fVar119;
  auVar124._12_4_ = fVar196 * fVar134;
  auVar145._0_4_ = fVar196 * (fVar139 + (fVar287 + auVar105._0_4_) * 0.33333334);
  auVar145._4_4_ = fVar196 * (fVar138 + (fVar222 + auVar105._4_4_) * 0.33333334);
  auVar145._8_4_ = fVar196 * (fVar119 + (fVar288 + auVar105._8_4_) * 0.33333334);
  auVar145._12_4_ = fVar196 * (fVar134 + (fVar223 + auVar105._12_4_) * 0.33333334);
  auVar229._0_4_ = fVar196 * auVar20._0_4_;
  auVar229._4_4_ = fVar196 * auVar20._4_4_;
  auVar229._8_4_ = fVar196 * auVar20._8_4_;
  auVar229._12_4_ = fVar196 * auVar20._12_4_;
  auVar167._0_4_ = fVar196 * auVar166._0_4_;
  auVar167._4_4_ = fVar196 * auVar166._4_4_;
  auVar167._8_4_ = fVar196 * auVar166._8_4_;
  auVar167._12_4_ = fVar196 * auVar166._12_4_;
  _local_510 = vfmadd231ps_fma(auVar124,auVar107,auVar54);
  _local_520 = vfmadd231ps_fma(auVar145,auVar107,auVar316);
  auVar22 = vfmadd231ps_fma(auVar229,auVar107,auVar19);
  auVar23 = vfmadd231ps_fma(auVar167,auVar107,_local_720);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_4d0 = vsubps_avx(local_4f0,auVar15);
  auVar16 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar17 = vshufps_avx(local_4d0,local_4d0,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar76 = pre->ray_space[k].vz.field_0.m128[0];
  fVar180 = pre->ray_space[k].vz.field_0.m128[1];
  fVar196 = pre->ray_space[k].vz.field_0.m128[2];
  fVar139 = pre->ray_space[k].vz.field_0.m128[3];
  auVar87._0_4_ = fVar76 * auVar17._0_4_;
  auVar87._4_4_ = fVar180 * auVar17._4_4_;
  auVar87._8_4_ = fVar196 * auVar17._8_4_;
  auVar87._12_4_ = fVar139 * auVar17._12_4_;
  auVar18 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar16);
  local_4e0 = vsubps_avx(auVar21,auVar15);
  auVar16 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar17 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar341._0_4_ = fVar76 * auVar17._0_4_;
  auVar341._4_4_ = fVar180 * auVar17._4_4_;
  auVar341._8_4_ = fVar196 * auVar17._8_4_;
  auVar341._12_4_ = fVar139 * auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar341,(undefined1  [16])aVar5,auVar16);
  local_3c0 = vsubps_avx(local_500,auVar15);
  auVar16 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar332._0_4_ = fVar76 * auVar16._0_4_;
  auVar332._4_4_ = fVar180 * auVar16._4_4_;
  auVar332._8_4_ = fVar196 * auVar16._8_4_;
  auVar332._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar19 = vfmadd231ps_fma(auVar332,(undefined1  [16])aVar5,auVar16);
  local_3d0 = vsubps_avx(auVar161,auVar15);
  auVar16 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar317._0_4_ = fVar76 * auVar16._0_4_;
  auVar317._4_4_ = fVar180 * auVar16._4_4_;
  auVar317._8_4_ = fVar196 * auVar16._8_4_;
  auVar317._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar20 = vfmadd231ps_fma(auVar317,(undefined1  [16])aVar5,auVar16);
  local_3e0 = vsubps_avx(_local_510,auVar15);
  auVar16 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar168._0_4_ = fVar76 * auVar16._0_4_;
  auVar168._4_4_ = fVar180 * auVar16._4_4_;
  auVar168._8_4_ = fVar196 * auVar16._8_4_;
  auVar168._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar24 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar16);
  local_3f0 = vsubps_avx(_local_520,auVar15);
  auVar16 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar230._0_4_ = fVar76 * auVar16._0_4_;
  auVar230._4_4_ = fVar180 * auVar16._4_4_;
  auVar230._8_4_ = fVar196 * auVar16._8_4_;
  auVar230._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar248 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar5,auVar16);
  local_400 = vsubps_avx(auVar22,auVar15);
  auVar16 = vshufps_avx(local_400,local_400,0xaa);
  auVar269._0_4_ = fVar76 * auVar16._0_4_;
  auVar269._4_4_ = fVar180 * auVar16._4_4_;
  auVar269._8_4_ = fVar196 * auVar16._8_4_;
  auVar269._12_4_ = fVar139 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_400,local_400,0x55);
  auVar16 = vfmadd231ps_fma(auVar269,(undefined1  [16])aVar5,auVar16);
  local_410 = vsubps_avx(auVar23,auVar15);
  auVar15 = vshufps_avx(local_410,local_410,0xaa);
  auVar187._0_4_ = fVar76 * auVar15._0_4_;
  auVar187._4_4_ = fVar180 * auVar15._4_4_;
  auVar187._8_4_ = fVar196 * auVar15._8_4_;
  auVar187._12_4_ = fVar139 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_410,local_410,0x55);
  auVar15 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar15);
  auVar202._4_4_ = local_4d0._0_4_;
  auVar202._0_4_ = local_4d0._0_4_;
  auVar202._8_4_ = local_4d0._0_4_;
  auVar202._12_4_ = local_4d0._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar80 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar202);
  auVar203._4_4_ = local_4e0._0_4_;
  auVar203._0_4_ = local_4e0._0_4_;
  auVar203._8_4_ = local_4e0._0_4_;
  auVar203._12_4_ = local_4e0._0_4_;
  auVar81 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar203);
  uVar77 = local_3c0._0_4_;
  auVar204._4_4_ = uVar77;
  auVar204._0_4_ = uVar77;
  auVar204._8_4_ = uVar77;
  auVar204._12_4_ = uVar77;
  auVar78 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar204);
  uVar77 = local_3d0._0_4_;
  auVar205._4_4_ = uVar77;
  auVar205._0_4_ = uVar77;
  auVar205._8_4_ = uVar77;
  auVar205._12_4_ = uVar77;
  auVar79 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar205);
  uVar77 = local_3e0._0_4_;
  auVar206._4_4_ = uVar77;
  auVar206._0_4_ = uVar77;
  auVar206._8_4_ = uVar77;
  auVar206._12_4_ = uVar77;
  auVar24 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar5,auVar206);
  uVar77 = local_3f0._0_4_;
  auVar207._4_4_ = uVar77;
  auVar207._0_4_ = uVar77;
  auVar207._8_4_ = uVar77;
  auVar207._12_4_ = uVar77;
  auVar248 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar5,auVar207);
  uVar77 = local_400._0_4_;
  auVar208._4_4_ = uVar77;
  auVar208._0_4_ = uVar77;
  auVar208._8_4_ = uVar77;
  auVar208._12_4_ = uVar77;
  auVar94 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar208);
  uVar77 = local_410._0_4_;
  auVar209._4_4_ = uVar77;
  auVar209._0_4_ = uVar77;
  auVar209._8_4_ = uVar77;
  auVar209._12_4_ = uVar77;
  auVar95 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar209);
  auVar18 = vmovlhps_avx(auVar80,auVar24);
  auVar19 = vmovlhps_avx(auVar81,auVar248);
  auVar20 = vmovlhps_avx(auVar78,auVar94);
  _local_4c0 = vmovlhps_avx(auVar79,auVar95);
  auVar15 = vminps_avx(auVar18,auVar19);
  auVar16 = vminps_avx(auVar20,_local_4c0);
  auVar17 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar18,auVar19);
  auVar16 = vmaxps_avx(auVar20,_local_4c0);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar17,auVar17,3);
  auVar17 = vminps_avx(auVar17,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vandps_avx(auVar17,auVar338);
  auVar16 = vandps_avx(auVar16,auVar338);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  local_2e0 = auVar15._0_4_ * 9.536743e-07;
  auVar210._8_8_ = auVar80._0_8_;
  auVar210._0_8_ = auVar80._0_8_;
  auVar250._8_8_ = auVar81._0_8_;
  auVar250._0_8_ = auVar81._0_8_;
  auVar279._8_8_ = auVar78._0_8_;
  auVar279._0_8_ = auVar78._0_8_;
  auVar318._0_8_ = auVar79._0_8_;
  auVar318._8_8_ = auVar318._0_8_;
  local_3b0 = ZEXT416((uint)local_2e0);
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_300 = -local_2e0;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_320 = uVar68;
  uStack_31c = uVar68;
  uStack_318 = uVar68;
  uStack_314 = uVar68;
  uStack_310 = uVar68;
  uStack_30c = uVar68;
  uStack_308 = uVar68;
  uStack_304 = uVar68;
  local_340 = uVar7;
  uStack_33c = uVar7;
  uStack_338 = uVar7;
  uStack_334 = uVar7;
  uStack_330 = uVar7;
  uStack_32c = uVar7;
  uStack_328 = uVar7;
  uStack_324 = uVar7;
  uVar69 = 0;
  fVar76 = *(float *)(ray + k * 4 + 0x60);
  auVar15 = vsubps_avx(auVar19,auVar18);
  auVar16 = vsubps_avx(auVar20,auVar19);
  auVar17 = vsubps_avx(_local_4c0,auVar20);
  local_430 = vsubps_avx(_local_510,local_4f0);
  local_440 = vsubps_avx(_local_520,auVar21);
  local_450 = vsubps_avx(auVar22,local_500);
  _local_460 = vsubps_avx(auVar23,auVar161);
  _local_7a0 = ZEXT816(0x3f80000000000000);
  local_420 = _local_7a0;
  do {
    auVar80 = vshufps_avx(_local_7a0,_local_7a0,0x50);
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = &DAT_3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar154._16_4_ = 0x3f800000;
    auVar154._0_16_ = auVar146;
    auVar154._20_4_ = 0x3f800000;
    auVar154._24_4_ = 0x3f800000;
    auVar154._28_4_ = 0x3f800000;
    auVar81 = vsubps_avx(auVar146,auVar80);
    fVar180 = auVar80._0_4_;
    fVar136 = auVar24._0_4_;
    auVar88._0_4_ = fVar136 * fVar180;
    fVar196 = auVar80._4_4_;
    fVar137 = auVar24._4_4_;
    auVar88._4_4_ = fVar137 * fVar196;
    fVar139 = auVar80._8_4_;
    auVar88._8_4_ = fVar136 * fVar139;
    fVar197 = auVar80._12_4_;
    auVar88._12_4_ = fVar137 * fVar197;
    fVar225 = auVar248._0_4_;
    auVar188._0_4_ = fVar225 * fVar180;
    fVar241 = auVar248._4_4_;
    auVar188._4_4_ = fVar241 * fVar196;
    auVar188._8_4_ = fVar225 * fVar139;
    auVar188._12_4_ = fVar241 * fVar197;
    fVar264 = auVar94._0_4_;
    auVar231._0_4_ = fVar264 * fVar180;
    fVar275 = auVar94._4_4_;
    auVar231._4_4_ = fVar275 * fVar196;
    auVar231._8_4_ = fVar264 * fVar139;
    auVar231._12_4_ = fVar275 * fVar197;
    fVar327 = auVar95._0_4_;
    auVar303._0_4_ = fVar327 * fVar180;
    fVar337 = auVar95._4_4_;
    auVar303._4_4_ = fVar337 * fVar196;
    auVar303._8_4_ = fVar327 * fVar139;
    auVar303._12_4_ = fVar337 * fVar197;
    auVar96 = vfmadd231ps_fma(auVar88,auVar81,auVar210);
    auVar102 = vfmadd231ps_fma(auVar188,auVar81,auVar250);
    auVar120 = vfmadd231ps_fma(auVar231,auVar81,auVar279);
    auVar253 = vfmadd231ps_fma(auVar303,auVar318,auVar81);
    local_6e0 = auVar253._0_4_;
    auVar80 = vmovshdup_avx(local_420);
    fVar180 = local_420._0_4_;
    fVar138 = (auVar80._0_4_ - fVar180) * 0.04761905;
    auVar263._4_4_ = fVar180;
    auVar263._0_4_ = fVar180;
    auVar263._8_4_ = fVar180;
    auVar263._12_4_ = fVar180;
    auVar263._16_4_ = fVar180;
    auVar263._20_4_ = fVar180;
    auVar263._24_4_ = fVar180;
    auVar263._28_4_ = fVar180;
    auVar131._0_8_ = auVar80._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar131._16_8_ = auVar131._0_8_;
    auVar131._24_8_ = auVar131._0_8_;
    auVar91 = vsubps_avx(auVar131,auVar263);
    uVar77 = auVar96._0_4_;
    auVar345._4_4_ = uVar77;
    auVar345._0_4_ = uVar77;
    auVar345._8_4_ = uVar77;
    auVar345._12_4_ = uVar77;
    auVar345._16_4_ = uVar77;
    auVar345._20_4_ = uVar77;
    auVar345._24_4_ = uVar77;
    auVar345._28_4_ = uVar77;
    auVar80 = vmovshdup_avx(auVar96);
    uVar200 = auVar80._0_8_;
    auVar325._8_8_ = uVar200;
    auVar325._0_8_ = uVar200;
    auVar325._16_8_ = uVar200;
    auVar325._24_8_ = uVar200;
    fVar119 = auVar102._0_4_;
    auVar115._4_4_ = fVar119;
    auVar115._0_4_ = fVar119;
    auVar115._8_4_ = fVar119;
    auVar115._12_4_ = fVar119;
    auVar115._16_4_ = fVar119;
    auVar115._20_4_ = fVar119;
    auVar115._24_4_ = fVar119;
    auVar115._28_4_ = fVar119;
    auVar81 = vmovshdup_avx(auVar102);
    auVar215._0_8_ = auVar81._0_8_;
    auVar215._8_8_ = auVar215._0_8_;
    auVar215._16_8_ = auVar215._0_8_;
    auVar215._24_8_ = auVar215._0_8_;
    fVar157 = auVar120._0_4_;
    auVar301._4_4_ = fVar157;
    auVar301._0_4_ = fVar157;
    auVar301._8_4_ = fVar157;
    auVar301._12_4_ = fVar157;
    auVar301._16_4_ = fVar157;
    auVar301._20_4_ = fVar157;
    auVar301._24_4_ = fVar157;
    auVar301._28_4_ = fVar157;
    auVar78 = vmovshdup_avx(auVar120);
    auVar274._0_8_ = auVar78._0_8_;
    auVar274._8_8_ = auVar274._0_8_;
    auVar274._16_8_ = auVar274._0_8_;
    auVar274._24_8_ = auVar274._0_8_;
    auVar79 = vmovshdup_avx(auVar253);
    auVar121 = vfmadd132ps_fma(auVar91,auVar263,_DAT_02020f20);
    auVar91 = vsubps_avx(auVar154,ZEXT1632(auVar121));
    fVar180 = auVar121._0_4_;
    auVar334._0_4_ = fVar119 * fVar180;
    fVar196 = auVar121._4_4_;
    auVar334._4_4_ = fVar119 * fVar196;
    fVar139 = auVar121._8_4_;
    auVar334._8_4_ = fVar119 * fVar139;
    fVar197 = auVar121._12_4_;
    auVar334._12_4_ = fVar119 * fVar197;
    auVar334._16_4_ = fVar119 * 0.0;
    auVar334._20_4_ = fVar119 * 0.0;
    auVar334._24_4_ = fVar119 * 0.0;
    auVar334._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar334,auVar91,auVar345);
    fVar134 = auVar81._0_4_;
    auVar311._0_4_ = fVar134 * fVar180;
    fVar135 = auVar81._4_4_;
    auVar311._4_4_ = fVar135 * fVar196;
    auVar311._8_4_ = fVar134 * fVar139;
    auVar311._12_4_ = fVar135 * fVar197;
    auVar311._16_4_ = fVar134 * 0.0;
    auVar311._20_4_ = fVar135 * 0.0;
    auVar311._24_4_ = fVar134 * 0.0;
    auVar311._28_4_ = 0;
    auVar160 = vfmadd231ps_fma(auVar311,auVar91,auVar325);
    auVar26._4_4_ = fVar157 * fVar196;
    auVar26._0_4_ = fVar157 * fVar180;
    auVar26._8_4_ = fVar157 * fVar139;
    auVar26._12_4_ = fVar157 * fVar197;
    auVar26._16_4_ = fVar157 * 0.0;
    auVar26._20_4_ = fVar157 * 0.0;
    auVar26._24_4_ = fVar157 * 0.0;
    auVar26._28_4_ = auVar80._4_4_;
    auVar181 = vfmadd231ps_fma(auVar26,auVar91,auVar115);
    fVar134 = auVar78._0_4_;
    fVar135 = auVar78._4_4_;
    auVar93._4_4_ = fVar135 * fVar196;
    auVar93._0_4_ = fVar134 * fVar180;
    auVar93._8_4_ = fVar134 * fVar139;
    auVar93._12_4_ = fVar135 * fVar197;
    auVar93._16_4_ = fVar134 * 0.0;
    auVar93._20_4_ = fVar135 * 0.0;
    auVar93._24_4_ = fVar134 * 0.0;
    auVar93._28_4_ = uVar77;
    auVar171 = vfmadd231ps_fma(auVar93,auVar91,auVar215);
    auVar80 = vshufps_avx(auVar96,auVar96,0xaa);
    auVar216._0_8_ = auVar80._0_8_;
    auVar216._8_8_ = auVar216._0_8_;
    auVar216._16_8_ = auVar216._0_8_;
    auVar216._24_8_ = auVar216._0_8_;
    auVar81 = vshufps_avx(auVar96,auVar96,0xff);
    uStack_758 = auVar81._0_8_;
    local_760 = (undefined1  [8])uStack_758;
    uStack_750 = uStack_758;
    uStack_748 = uStack_758;
    auVar25._4_4_ = fVar196 * local_6e0;
    auVar25._0_4_ = fVar180 * local_6e0;
    auVar25._8_4_ = fVar139 * local_6e0;
    auVar25._12_4_ = fVar197 * local_6e0;
    auVar25._16_4_ = local_6e0 * 0.0;
    auVar25._20_4_ = local_6e0 * 0.0;
    auVar25._24_4_ = local_6e0 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar191 = vfmadd231ps_fma(auVar25,auVar91,auVar301);
    auVar78 = vshufps_avx(auVar102,auVar102,0xaa);
    auVar178._0_8_ = auVar78._0_8_;
    auVar178._8_8_ = auVar178._0_8_;
    auVar178._16_8_ = auVar178._0_8_;
    auVar178._24_8_ = auVar178._0_8_;
    auVar96 = vshufps_avx(auVar102,auVar102,0xff);
    auVar195._0_8_ = auVar96._0_8_;
    auVar195._8_8_ = auVar195._0_8_;
    auVar195._16_8_ = auVar195._0_8_;
    auVar195._24_8_ = auVar195._0_8_;
    fVar134 = auVar79._0_4_;
    fVar135 = auVar79._4_4_;
    auVar27._4_4_ = fVar135 * fVar196;
    auVar27._0_4_ = fVar134 * fVar180;
    auVar27._8_4_ = fVar134 * fVar139;
    auVar27._12_4_ = fVar135 * fVar197;
    auVar27._16_4_ = fVar134 * 0.0;
    auVar27._20_4_ = fVar135 * 0.0;
    auVar27._24_4_ = fVar134 * 0.0;
    auVar27._28_4_ = fVar157;
    auVar226 = vfmadd231ps_fma(auVar27,auVar91,auVar274);
    auVar28._28_4_ = fVar119;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar181._12_4_ * fVar197,
                            CONCAT48(auVar181._8_4_ * fVar139,
                                     CONCAT44(auVar181._4_4_ * fVar196,auVar181._0_4_ * fVar180))));
    auVar121 = vfmadd231ps_fma(auVar28,auVar91,ZEXT1632(auVar121));
    auVar29._28_4_ = auVar81._4_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar171._12_4_ * fVar197,
                            CONCAT48(auVar171._8_4_ * fVar139,
                                     CONCAT44(auVar171._4_4_ * fVar196,auVar171._0_4_ * fVar180))));
    auVar160 = vfmadd231ps_fma(auVar29,auVar91,ZEXT1632(auVar160));
    auVar81 = vshufps_avx(auVar120,auVar120,0xaa);
    uVar200 = auVar81._0_8_;
    auVar312._8_8_ = uVar200;
    auVar312._0_8_ = uVar200;
    auVar312._16_8_ = uVar200;
    auVar312._24_8_ = uVar200;
    auVar79 = vshufps_avx(auVar120,auVar120,0xff);
    uVar200 = auVar79._0_8_;
    auVar335._8_8_ = uVar200;
    auVar335._0_8_ = uVar200;
    auVar335._16_8_ = uVar200;
    auVar335._24_8_ = uVar200;
    auVar181 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar191._12_4_,
                                                  CONCAT48(fVar139 * auVar191._8_4_,
                                                           CONCAT44(fVar196 * auVar191._4_4_,
                                                                    fVar180 * auVar191._0_4_)))),
                               auVar91,ZEXT1632(auVar181));
    auVar102 = vshufps_avx(auVar253,auVar253,0xaa);
    auVar120 = vshufps_avx(auVar253,auVar253,0xff);
    local_6e0 = auVar120._0_4_;
    fStack_6dc = auVar120._4_4_;
    auVar30._28_4_ = fStack_6dc;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar226._12_4_ * fVar197,
                            CONCAT48(auVar226._8_4_ * fVar139,
                                     CONCAT44(auVar226._4_4_ * fVar196,auVar226._0_4_ * fVar180))));
    auVar120 = vfmadd231ps_fma(auVar30,auVar91,ZEXT1632(auVar171));
    auVar253 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar181._12_4_,
                                                  CONCAT48(fVar139 * auVar181._8_4_,
                                                           CONCAT44(fVar196 * auVar181._4_4_,
                                                                    fVar180 * auVar181._0_4_)))),
                               auVar91,ZEXT1632(auVar121));
    auVar26 = vsubps_avx(ZEXT1632(auVar181),ZEXT1632(auVar121));
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar120._12_4_,
                                                  CONCAT48(fVar139 * auVar120._8_4_,
                                                           CONCAT44(fVar196 * auVar120._4_4_,
                                                                    fVar180 * auVar120._0_4_)))),
                               auVar91,ZEXT1632(auVar160));
    auVar92 = vsubps_avx(ZEXT1632(auVar120),ZEXT1632(auVar160));
    fVar276 = fVar138 * auVar26._0_4_ * 3.0;
    fVar286 = fVar138 * auVar26._4_4_ * 3.0;
    auVar313._4_4_ = fVar286;
    auVar313._0_4_ = fVar276;
    fVar198 = fVar138 * auVar26._8_4_ * 3.0;
    auVar313._8_4_ = fVar198;
    fVar220 = fVar138 * auVar26._12_4_ * 3.0;
    auVar313._12_4_ = fVar220;
    fVar287 = fVar138 * auVar26._16_4_ * 3.0;
    auVar313._16_4_ = fVar287;
    fVar288 = fVar138 * auVar26._20_4_ * 3.0;
    auVar313._20_4_ = fVar288;
    fVar289 = fVar138 * auVar26._24_4_ * 3.0;
    auVar313._24_4_ = fVar289;
    auVar313._28_4_ = 0x40400000;
    local_780._0_4_ = fVar138 * auVar92._0_4_ * 3.0;
    local_780._4_4_ = fVar138 * auVar92._4_4_ * 3.0;
    fStack_778 = fVar138 * auVar92._8_4_ * 3.0;
    fStack_774 = fVar138 * auVar92._12_4_ * 3.0;
    fStack_770 = fVar138 * auVar92._16_4_ * 3.0;
    fStack_76c = fVar138 * auVar92._20_4_ * 3.0;
    fStack_768 = fVar138 * auVar92._24_4_ * 3.0;
    fStack_764 = auVar92._28_4_;
    fVar119 = auVar78._0_4_;
    fVar134 = auVar78._4_4_;
    auVar31._4_4_ = fVar134 * fVar196;
    auVar31._0_4_ = fVar119 * fVar180;
    auVar31._8_4_ = fVar119 * fVar139;
    auVar31._12_4_ = fVar134 * fVar197;
    auVar31._16_4_ = fVar119 * 0.0;
    auVar31._20_4_ = fVar134 * 0.0;
    auVar31._24_4_ = fVar119 * 0.0;
    auVar31._28_4_ = auVar26._28_4_;
    auVar78 = vfmadd231ps_fma(auVar31,auVar91,auVar216);
    fVar119 = auVar96._0_4_;
    fVar135 = auVar96._4_4_;
    auVar32._4_4_ = fVar135 * fVar196;
    auVar32._0_4_ = fVar119 * fVar180;
    auVar32._8_4_ = fVar119 * fVar139;
    auVar32._12_4_ = fVar135 * fVar197;
    auVar32._16_4_ = fVar119 * 0.0;
    auVar32._20_4_ = fVar135 * 0.0;
    auVar32._24_4_ = fVar119 * 0.0;
    auVar32._28_4_ = auVar80._4_4_;
    auVar80 = vfmadd231ps_fma(auVar32,auVar91,_local_760);
    fVar119 = auVar81._0_4_;
    fVar135 = auVar81._4_4_;
    auVar33._4_4_ = fVar135 * fVar196;
    auVar33._0_4_ = fVar119 * fVar180;
    auVar33._8_4_ = fVar119 * fVar139;
    auVar33._12_4_ = fVar135 * fVar197;
    auVar33._16_4_ = fVar119 * 0.0;
    auVar33._20_4_ = fVar135 * 0.0;
    auVar33._24_4_ = fVar119 * 0.0;
    auVar33._28_4_ = fVar138;
    auVar81 = vfmadd231ps_fma(auVar33,auVar91,auVar178);
    fVar119 = auVar79._0_4_;
    fVar157 = auVar79._4_4_;
    auVar34._4_4_ = fVar157 * fVar196;
    auVar34._0_4_ = fVar119 * fVar180;
    auVar34._8_4_ = fVar119 * fVar139;
    auVar34._12_4_ = fVar157 * fVar197;
    auVar34._16_4_ = fVar119 * 0.0;
    auVar34._20_4_ = fVar157 * 0.0;
    auVar34._24_4_ = fVar119 * 0.0;
    auVar34._28_4_ = fVar134;
    auVar79 = vfmadd231ps_fma(auVar34,auVar91,auVar195);
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar253));
    fVar119 = auVar102._0_4_;
    fVar134 = auVar102._4_4_;
    auVar35._4_4_ = fVar134 * fVar196;
    auVar35._0_4_ = fVar119 * fVar180;
    auVar35._8_4_ = fVar119 * fVar139;
    auVar35._12_4_ = fVar134 * fVar197;
    auVar35._16_4_ = fVar119 * 0.0;
    auVar35._20_4_ = fVar134 * 0.0;
    auVar35._24_4_ = fVar119 * 0.0;
    auVar35._28_4_ = auVar27._28_4_;
    auVar96 = vfmadd231ps_fma(auVar35,auVar91,auVar312);
    auVar28 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar121));
    auVar36._4_4_ = fVar196 * fStack_6dc;
    auVar36._0_4_ = fVar180 * local_6e0;
    auVar36._8_4_ = fVar139 * local_6e0;
    auVar36._12_4_ = fVar197 * fStack_6dc;
    auVar36._16_4_ = local_6e0 * 0.0;
    auVar36._20_4_ = fStack_6dc * 0.0;
    auVar36._24_4_ = local_6e0 * 0.0;
    auVar36._28_4_ = fVar135;
    auVar102 = vfmadd231ps_fma(auVar36,auVar91,auVar335);
    auVar37._28_4_ = fVar134;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * auVar81._12_4_,
                            CONCAT48(fVar139 * auVar81._8_4_,
                                     CONCAT44(fVar196 * auVar81._4_4_,fVar180 * auVar81._0_4_))));
    auVar78 = vfmadd231ps_fma(auVar37,auVar91,ZEXT1632(auVar78));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar79._12_4_,
                                                 CONCAT48(fVar139 * auVar79._8_4_,
                                                          CONCAT44(fVar196 * auVar79._4_4_,
                                                                   fVar180 * auVar79._0_4_)))),
                              auVar91,ZEXT1632(auVar80));
    fVar276 = auVar253._0_4_ + fVar276;
    fVar286 = auVar253._4_4_ + fVar286;
    fVar198 = auVar253._8_4_ + fVar198;
    fVar220 = auVar253._12_4_ + fVar220;
    fVar287 = fVar287 + 0.0;
    fVar288 = fVar288 + 0.0;
    fVar289 = fVar289 + 0.0;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar102._12_4_ * fVar197,
                            CONCAT48(auVar102._8_4_ * fVar139,
                                     CONCAT44(auVar102._4_4_ * fVar196,auVar102._0_4_ * fVar180))));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar96._12_4_,
                                                 CONCAT48(fVar139 * auVar96._8_4_,
                                                          CONCAT44(fVar196 * auVar96._4_4_,
                                                                   fVar180 * auVar96._0_4_)))),
                              auVar91,ZEXT1632(auVar81));
    auVar79 = vfmadd231ps_fma(auVar38,auVar91,ZEXT1632(auVar79));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar81._12_4_,
                                                 CONCAT48(fVar139 * auVar81._8_4_,
                                                          CONCAT44(fVar196 * auVar81._4_4_,
                                                                   fVar180 * auVar81._0_4_)))),
                              auVar91,ZEXT1632(auVar78));
    auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar197 * auVar79._12_4_,
                                                  CONCAT48(fVar139 * auVar79._8_4_,
                                                           CONCAT44(fVar196 * auVar79._4_4_,
                                                                    fVar180 * auVar79._0_4_)))),
                               ZEXT1632(auVar80),auVar91);
    auVar91 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar78));
    auVar26 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
    fVar180 = fVar138 * auVar91._0_4_ * 3.0;
    fVar196 = fVar138 * auVar91._4_4_ * 3.0;
    auVar39._4_4_ = fVar196;
    auVar39._0_4_ = fVar180;
    fVar139 = fVar138 * auVar91._8_4_ * 3.0;
    auVar39._8_4_ = fVar139;
    fVar197 = fVar138 * auVar91._12_4_ * 3.0;
    auVar39._12_4_ = fVar197;
    fVar157 = fVar138 * auVar91._16_4_ * 3.0;
    auVar39._16_4_ = fVar157;
    fVar158 = fVar138 * auVar91._20_4_ * 3.0;
    auVar39._20_4_ = fVar158;
    fVar159 = fVar138 * auVar91._24_4_ * 3.0;
    auVar39._24_4_ = fVar159;
    auVar39._28_4_ = 0x40400000;
    auVar240._0_4_ = fVar138 * auVar26._0_4_ * 3.0;
    auVar240._4_4_ = fVar138 * auVar26._4_4_ * 3.0;
    auVar240._8_4_ = fVar138 * auVar26._8_4_ * 3.0;
    auVar240._12_4_ = fVar138 * auVar26._12_4_ * 3.0;
    auVar240._16_4_ = fVar138 * auVar26._16_4_ * 3.0;
    auVar240._20_4_ = fVar138 * auVar26._20_4_ * 3.0;
    auVar240._24_4_ = fVar138 * auVar26._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar29 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar96));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar102));
    auVar91 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar253));
    auVar26 = vsubps_avx(ZEXT1632(auVar102),ZEXT1632(auVar121));
    auVar93 = vsubps_avx(auVar29,auVar27);
    fVar199 = auVar91._0_4_ + auVar93._0_4_;
    fVar219 = auVar91._4_4_ + auVar93._4_4_;
    fVar218 = auVar91._8_4_ + auVar93._8_4_;
    fVar221 = auVar91._12_4_ + auVar93._12_4_;
    fVar222 = auVar91._16_4_ + auVar93._16_4_;
    fVar223 = auVar91._20_4_ + auVar93._20_4_;
    fVar224 = auVar91._24_4_ + auVar93._24_4_;
    auVar25 = vsubps_avx(local_1c0,auVar28);
    auVar326._0_4_ = auVar26._0_4_ + auVar25._0_4_;
    auVar326._4_4_ = auVar26._4_4_ + auVar25._4_4_;
    auVar326._8_4_ = auVar26._8_4_ + auVar25._8_4_;
    auVar326._12_4_ = auVar26._12_4_ + auVar25._12_4_;
    auVar326._16_4_ = auVar26._16_4_ + auVar25._16_4_;
    auVar326._20_4_ = auVar26._20_4_ + auVar25._20_4_;
    auVar326._24_4_ = auVar26._24_4_ + auVar25._24_4_;
    auVar326._28_4_ = auVar26._28_4_ + auVar25._28_4_;
    fVar138 = auVar121._0_4_;
    local_2a0 = fVar138 + (float)local_780._0_4_;
    fVar119 = auVar121._4_4_;
    fStack_29c = fVar119 + (float)local_780._4_4_;
    fVar134 = auVar121._8_4_;
    fStack_298 = fVar134 + fStack_778;
    fVar135 = auVar121._12_4_;
    fStack_294 = fVar135 + fStack_774;
    fStack_290 = fStack_770 + 0.0;
    fStack_28c = fStack_76c + 0.0;
    fStack_288 = fStack_768 + 0.0;
    fStack_284 = auVar92._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar253);
    auVar26 = vsubps_avx(local_1e0,auVar313);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar26);
    local_200 = ZEXT1632(auVar121);
    auVar26 = vsubps_avx(local_200,_local_780);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar26);
    local_240._0_4_ = auVar96._0_4_ + fVar180;
    local_240._4_4_ = auVar96._4_4_ + fVar196;
    local_240._8_4_ = auVar96._8_4_ + fVar139;
    local_240._12_4_ = auVar96._12_4_ + fVar197;
    local_240._16_4_ = fVar157 + 0.0;
    local_240._20_4_ = fVar158 + 0.0;
    local_240._24_4_ = fVar159 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar313 = ZEXT1632(auVar96);
    auVar26 = vsubps_avx(auVar313,auVar39);
    auVar30 = vpermps_avx2(_DAT_0205d4a0,auVar26);
    fVar180 = auVar102._0_4_;
    local_280._0_4_ = fVar180 + auVar240._0_4_;
    fVar196 = auVar102._4_4_;
    local_280._4_4_ = fVar196 + auVar240._4_4_;
    fVar139 = auVar102._8_4_;
    local_280._8_4_ = fVar139 + auVar240._8_4_;
    fVar197 = auVar102._12_4_;
    local_280._12_4_ = fVar197 + auVar240._12_4_;
    local_280._16_4_ = auVar240._16_4_ + 0.0;
    local_280._20_4_ = auVar240._20_4_ + 0.0;
    local_280._24_4_ = auVar240._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar26 = vsubps_avx(ZEXT1632(auVar102),auVar240);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar26);
    auVar40._4_4_ = fVar119 * fVar219;
    auVar40._0_4_ = fVar138 * fVar199;
    auVar40._8_4_ = fVar134 * fVar218;
    auVar40._12_4_ = fVar135 * fVar221;
    auVar40._16_4_ = fVar222 * 0.0;
    auVar40._20_4_ = fVar223 * 0.0;
    auVar40._24_4_ = fVar224 * 0.0;
    auVar40._28_4_ = auVar26._28_4_;
    auVar80 = vfnmadd231ps_fma(auVar40,local_1e0,auVar326);
    auVar41._4_4_ = fStack_29c * fVar219;
    auVar41._0_4_ = local_2a0 * fVar199;
    auVar41._8_4_ = fStack_298 * fVar218;
    auVar41._12_4_ = fStack_294 * fVar221;
    auVar41._16_4_ = fStack_290 * fVar222;
    auVar41._20_4_ = fStack_28c * fVar223;
    auVar41._24_4_ = fStack_288 * fVar224;
    auVar41._28_4_ = auVar30._28_4_;
    auVar55._4_4_ = fVar286;
    auVar55._0_4_ = fVar276;
    auVar55._8_4_ = fVar198;
    auVar55._12_4_ = fVar220;
    auVar55._16_4_ = fVar287;
    auVar55._20_4_ = fVar288;
    auVar55._24_4_ = fVar289;
    auVar55._28_4_ = 0x40400000;
    auVar81 = vfnmadd231ps_fma(auVar41,auVar326,auVar55);
    auVar42._4_4_ = local_2c0._4_4_ * fVar219;
    auVar42._0_4_ = local_2c0._0_4_ * fVar199;
    auVar42._8_4_ = local_2c0._8_4_ * fVar218;
    auVar42._12_4_ = local_2c0._12_4_ * fVar221;
    auVar42._16_4_ = local_2c0._16_4_ * fVar222;
    auVar42._20_4_ = local_2c0._20_4_ * fVar223;
    auVar42._24_4_ = local_2c0._24_4_ * fVar224;
    auVar42._28_4_ = fStack_284;
    auVar78 = vfnmadd231ps_fma(auVar42,local_220,auVar326);
    local_760._0_4_ = auVar28._0_4_;
    local_760._4_4_ = auVar28._4_4_;
    uStack_758._0_4_ = auVar28._8_4_;
    uStack_758._4_4_ = auVar28._12_4_;
    uStack_750._0_4_ = auVar28._16_4_;
    uStack_750._4_4_ = auVar28._20_4_;
    uStack_748._0_4_ = auVar28._24_4_;
    auVar43._4_4_ = fVar219 * (float)local_760._4_4_;
    auVar43._0_4_ = fVar199 * (float)local_760._0_4_;
    auVar43._8_4_ = fVar218 * (float)uStack_758;
    auVar43._12_4_ = fVar221 * uStack_758._4_4_;
    auVar43._16_4_ = fVar222 * (float)uStack_750;
    auVar43._20_4_ = fVar223 * uStack_750._4_4_;
    auVar43._24_4_ = fVar224 * (float)uStack_748;
    auVar43._28_4_ = local_2c0._28_4_;
    auVar79 = vfnmadd231ps_fma(auVar43,auVar27,auVar326);
    auVar61._4_4_ = fVar196 * fVar219;
    auVar61._0_4_ = fVar180 * fVar199;
    auVar61._8_4_ = fVar139 * fVar218;
    auVar61._12_4_ = fVar197 * fVar221;
    auVar61._16_4_ = fVar222 * 0.0;
    auVar61._20_4_ = fVar223 * 0.0;
    auVar61._24_4_ = fVar224 * 0.0;
    auVar61._28_4_ = DAT_0205d4a0._28_4_;
    auVar96 = vfnmadd231ps_fma(auVar61,auVar313,auVar326);
    auVar44._4_4_ = local_280._4_4_ * fVar219;
    auVar44._0_4_ = local_280._0_4_ * fVar199;
    auVar44._8_4_ = local_280._8_4_ * fVar218;
    auVar44._12_4_ = local_280._12_4_ * fVar221;
    auVar44._16_4_ = local_280._16_4_ * fVar222;
    auVar44._20_4_ = local_280._20_4_ * fVar223;
    auVar44._24_4_ = local_280._24_4_ * fVar224;
    auVar44._28_4_ = auVar27._28_4_;
    auVar120 = vfnmadd231ps_fma(auVar44,local_240,auVar326);
    auVar45._4_4_ = local_260._4_4_ * fVar219;
    auVar45._0_4_ = local_260._0_4_ * fVar199;
    auVar45._8_4_ = local_260._8_4_ * fVar218;
    auVar45._12_4_ = local_260._12_4_ * fVar221;
    auVar45._16_4_ = local_260._16_4_ * fVar222;
    auVar45._20_4_ = local_260._20_4_ * fVar223;
    auVar45._24_4_ = local_260._24_4_ * fVar224;
    auVar45._28_4_ = local_220._28_4_;
    auVar253 = vfnmadd231ps_fma(auVar45,auVar326,auVar30);
    auVar46._4_4_ = local_1c0._4_4_ * fVar219;
    auVar46._0_4_ = local_1c0._0_4_ * fVar199;
    auVar46._8_4_ = local_1c0._8_4_ * fVar218;
    auVar46._12_4_ = local_1c0._12_4_ * fVar221;
    auVar46._16_4_ = local_1c0._16_4_ * fVar222;
    auVar46._20_4_ = local_1c0._20_4_ * fVar223;
    auVar46._24_4_ = local_1c0._24_4_ * fVar224;
    auVar46._28_4_ = auVar91._28_4_ + auVar93._28_4_;
    auVar121 = vfnmadd231ps_fma(auVar46,auVar326,auVar29);
    auVar26 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar81));
    auVar91 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar81));
    auVar92 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar79));
    auVar92 = vminps_avx(auVar26,auVar92);
    auVar26 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar79));
    auVar91 = vmaxps_avx(auVar91,auVar26);
    auVar93 = vminps_avx(ZEXT1632(auVar96),ZEXT1632(auVar120));
    auVar26 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar120));
    auVar25 = vminps_avx(ZEXT1632(auVar253),ZEXT1632(auVar121));
    auVar93 = vminps_avx(auVar93,auVar25);
    auVar93 = vminps_avx(auVar92,auVar93);
    auVar92 = vmaxps_avx(ZEXT1632(auVar253),ZEXT1632(auVar121));
    auVar26 = vmaxps_avx(auVar26,auVar92);
    auVar26 = vmaxps_avx(auVar91,auVar26);
    auVar60._4_4_ = fStack_2dc;
    auVar60._0_4_ = local_2e0;
    auVar60._8_4_ = fStack_2d8;
    auVar60._12_4_ = fStack_2d4;
    auVar60._16_4_ = fStack_2d0;
    auVar60._20_4_ = fStack_2cc;
    auVar60._24_4_ = fStack_2c8;
    auVar60._28_4_ = fStack_2c4;
    auVar91 = vcmpps_avx(auVar93,auVar60,2);
    auVar59._4_4_ = fStack_2fc;
    auVar59._0_4_ = local_300;
    auVar59._8_4_ = fStack_2f8;
    auVar59._12_4_ = fStack_2f4;
    auVar59._16_4_ = fStack_2f0;
    auVar59._20_4_ = fStack_2ec;
    auVar59._24_4_ = fStack_2e8;
    auVar59._28_4_ = fStack_2e4;
    auVar26 = vcmpps_avx(auVar26,auVar59,5);
    auVar91 = vandps_avx(auVar26,auVar91);
    auVar26 = local_3a0 & auVar91;
    uVar66 = 0;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(auVar27,local_1e0);
      auVar92 = vsubps_avx(auVar29,auVar313);
      fVar158 = auVar26._0_4_ + auVar92._0_4_;
      fVar159 = auVar26._4_4_ + auVar92._4_4_;
      fVar199 = auVar26._8_4_ + auVar92._8_4_;
      fVar219 = auVar26._12_4_ + auVar92._12_4_;
      fVar218 = auVar26._16_4_ + auVar92._16_4_;
      fVar221 = auVar26._20_4_ + auVar92._20_4_;
      fVar222 = auVar26._24_4_ + auVar92._24_4_;
      auVar93 = vsubps_avx(auVar28,local_200);
      auVar25 = vsubps_avx(local_1c0,ZEXT1632(auVar102));
      auVar116._0_4_ = auVar93._0_4_ + auVar25._0_4_;
      auVar116._4_4_ = auVar93._4_4_ + auVar25._4_4_;
      auVar116._8_4_ = auVar93._8_4_ + auVar25._8_4_;
      auVar116._12_4_ = auVar93._12_4_ + auVar25._12_4_;
      auVar116._16_4_ = auVar93._16_4_ + auVar25._16_4_;
      auVar116._20_4_ = auVar93._20_4_ + auVar25._20_4_;
      auVar116._24_4_ = auVar93._24_4_ + auVar25._24_4_;
      fVar157 = auVar25._28_4_;
      auVar116._28_4_ = auVar93._28_4_ + fVar157;
      auVar336._0_4_ = fVar138 * fVar158;
      auVar336._4_4_ = fVar119 * fVar159;
      auVar336._8_4_ = fVar134 * fVar199;
      auVar336._12_4_ = fVar135 * fVar219;
      auVar336._16_4_ = fVar218 * 0.0;
      auVar336._20_4_ = fVar221 * 0.0;
      auVar336._24_4_ = fVar222 * 0.0;
      auVar336._28_4_ = 0;
      auVar96 = vfnmadd231ps_fma(auVar336,auVar116,local_1e0);
      auVar47._4_4_ = fVar159 * fStack_29c;
      auVar47._0_4_ = fVar158 * local_2a0;
      auVar47._8_4_ = fVar199 * fStack_298;
      auVar47._12_4_ = fVar219 * fStack_294;
      auVar47._16_4_ = fVar218 * fStack_290;
      auVar47._20_4_ = fVar221 * fStack_28c;
      auVar47._24_4_ = fVar222 * fStack_288;
      auVar47._28_4_ = fVar157;
      auVar56._4_4_ = fVar286;
      auVar56._0_4_ = fVar276;
      auVar56._8_4_ = fVar198;
      auVar56._12_4_ = fVar220;
      auVar56._16_4_ = fVar287;
      auVar56._20_4_ = fVar288;
      auVar56._24_4_ = fVar289;
      auVar56._28_4_ = 0x40400000;
      auVar80 = vfnmadd213ps_fma(auVar56,auVar116,auVar47);
      auVar48._4_4_ = fVar159 * local_2c0._4_4_;
      auVar48._0_4_ = fVar158 * local_2c0._0_4_;
      auVar48._8_4_ = fVar199 * local_2c0._8_4_;
      auVar48._12_4_ = fVar219 * local_2c0._12_4_;
      auVar48._16_4_ = fVar218 * local_2c0._16_4_;
      auVar48._20_4_ = fVar221 * local_2c0._20_4_;
      auVar48._24_4_ = fVar222 * local_2c0._24_4_;
      auVar48._28_4_ = fVar157;
      auVar81 = vfnmadd213ps_fma(local_220,auVar116,auVar48);
      auVar49._4_4_ = (float)local_760._4_4_ * fVar159;
      auVar49._0_4_ = (float)local_760._0_4_ * fVar158;
      auVar49._8_4_ = (float)uStack_758 * fVar199;
      auVar49._12_4_ = uStack_758._4_4_ * fVar219;
      auVar49._16_4_ = (float)uStack_750 * fVar218;
      auVar49._20_4_ = uStack_750._4_4_ * fVar221;
      auVar49._24_4_ = (float)uStack_748 * fVar222;
      auVar49._28_4_ = fVar157;
      auVar102 = vfnmadd231ps_fma(auVar49,auVar116,auVar27);
      auVar132._0_4_ = fVar180 * fVar158;
      auVar132._4_4_ = fVar196 * fVar159;
      auVar132._8_4_ = fVar139 * fVar199;
      auVar132._12_4_ = fVar197 * fVar219;
      auVar132._16_4_ = fVar218 * 0.0;
      auVar132._20_4_ = fVar221 * 0.0;
      auVar132._24_4_ = fVar222 * 0.0;
      auVar132._28_4_ = 0;
      auVar120 = vfnmadd231ps_fma(auVar132,auVar116,auVar313);
      auVar50._4_4_ = fVar159 * local_280._4_4_;
      auVar50._0_4_ = fVar158 * local_280._0_4_;
      auVar50._8_4_ = fVar199 * local_280._8_4_;
      auVar50._12_4_ = fVar219 * local_280._12_4_;
      auVar50._16_4_ = fVar218 * local_280._16_4_;
      auVar50._20_4_ = fVar221 * local_280._20_4_;
      auVar50._24_4_ = fVar222 * local_280._24_4_;
      auVar50._28_4_ = auVar28._28_4_;
      auVar78 = vfnmadd213ps_fma(local_240,auVar116,auVar50);
      auVar51._4_4_ = fVar159 * local_260._4_4_;
      auVar51._0_4_ = fVar158 * local_260._0_4_;
      auVar51._8_4_ = fVar199 * local_260._8_4_;
      auVar51._12_4_ = fVar219 * local_260._12_4_;
      auVar51._16_4_ = fVar218 * local_260._16_4_;
      auVar51._20_4_ = fVar221 * local_260._20_4_;
      auVar51._24_4_ = fVar222 * local_260._24_4_;
      auVar51._28_4_ = auVar28._28_4_;
      auVar79 = vfnmadd213ps_fma(auVar30,auVar116,auVar51);
      auVar52._4_4_ = local_1c0._4_4_ * fVar159;
      auVar52._0_4_ = local_1c0._0_4_ * fVar158;
      auVar52._8_4_ = local_1c0._8_4_ * fVar199;
      auVar52._12_4_ = local_1c0._12_4_ * fVar219;
      auVar52._16_4_ = local_1c0._16_4_ * fVar218;
      auVar52._20_4_ = local_1c0._20_4_ * fVar221;
      auVar52._24_4_ = local_1c0._24_4_ * fVar222;
      auVar52._28_4_ = auVar26._28_4_ + auVar92._28_4_;
      auVar253 = vfnmadd231ps_fma(auVar52,auVar116,auVar29);
      auVar92 = vminps_avx(ZEXT1632(auVar96),ZEXT1632(auVar80));
      auVar26 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar80));
      auVar93 = vminps_avx(ZEXT1632(auVar81),ZEXT1632(auVar102));
      auVar93 = vminps_avx(auVar92,auVar93);
      auVar92 = vmaxps_avx(ZEXT1632(auVar81),ZEXT1632(auVar102));
      auVar26 = vmaxps_avx(auVar26,auVar92);
      auVar25 = vminps_avx(ZEXT1632(auVar120),ZEXT1632(auVar78));
      auVar92 = vmaxps_avx(ZEXT1632(auVar120),ZEXT1632(auVar78));
      auVar27 = vminps_avx(ZEXT1632(auVar79),ZEXT1632(auVar253));
      auVar25 = vminps_avx(auVar25,auVar27);
      auVar25 = vminps_avx(auVar93,auVar25);
      auVar93 = vmaxps_avx(ZEXT1632(auVar79),ZEXT1632(auVar253));
      auVar92 = vmaxps_avx(auVar92,auVar93);
      auVar92 = vmaxps_avx(auVar26,auVar92);
      auVar26 = vcmpps_avx(auVar25,auVar60,2);
      auVar92 = vcmpps_avx(auVar92,auVar59,5);
      auVar26 = vandps_avx(auVar92,auVar26);
      auVar91 = vandps_avx(auVar91,local_3a0);
      auVar92 = auVar91 & auVar26;
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar92 >> 0x7f,0) != '\0') ||
            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar92 >> 0xbf,0) != '\0') ||
          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar92[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar26,auVar91);
        uVar66 = vmovmskps_avx(auVar91);
      }
    }
    if (uVar66 != 0) {
      auStack_4b0[uVar69] = uVar66;
      uVar200 = vmovlps_avx(local_420);
      *(undefined8 *)(&uStack_380 + uVar69 * 2) = uVar200;
      uVar74 = vmovlps_avx(_local_7a0);
      auStack_1a0[uVar69] = uVar74;
      uVar69 = (ulong)((int)uVar69 + 1);
    }
    do {
      if ((int)uVar69 == 0) {
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar90._4_4_ = uVar77;
        auVar90._0_4_ = uVar77;
        auVar90._8_4_ = uVar77;
        auVar90._12_4_ = uVar77;
        auVar15 = vcmpps_avx(local_470,auVar90,2);
        uVar68 = vmovmskps_avx(auVar15);
        uVar64 = uVar64 & uVar64 + 0xf & uVar68;
        if (uVar64 == 0) {
          return;
        }
        goto LAB_0179164c;
      }
      uVar67 = (int)uVar69 - 1;
      uVar70 = (ulong)uVar67;
      uVar73 = auStack_4b0[uVar70];
      uVar66 = (&uStack_380)[uVar70 * 2];
      fVar180 = afStack_37c[uVar70 * 2];
      iVar65 = 0;
      for (uVar74 = (ulong)uVar73; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        iVar65 = iVar65 + 1;
      }
      uVar73 = uVar73 - 1 & uVar73;
      if (uVar73 == 0) {
        uVar69 = (ulong)uVar67;
      }
      register0x00001348 = 0;
      local_7a0 = auStack_1a0[uVar70];
      auStack_4b0[uVar70] = uVar73;
      fVar196 = (float)(iVar65 + 1) * 0.14285715;
      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * (float)iVar65 * 0.14285715)),
                                ZEXT416(uVar66),ZEXT416((uint)(1.0 - (float)iVar65 * 0.14285715)));
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar196)),ZEXT416(uVar66),
                                ZEXT416((uint)(1.0 - fVar196)));
      auVar217._0_4_ = auVar80._0_4_;
      fVar196 = auVar81._0_4_;
      fVar180 = fVar196 - auVar217._0_4_;
      if (0.16666667 <= fVar180) break;
      auVar78 = vshufps_avx(_local_7a0,_local_7a0,0x50);
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = &DAT_3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar79 = vsubps_avx(auVar125,auVar78);
      fVar139 = auVar78._0_4_;
      auVar147._0_4_ = fVar139 * fVar136;
      fVar197 = auVar78._4_4_;
      auVar147._4_4_ = fVar197 * fVar137;
      fVar138 = auVar78._8_4_;
      auVar147._8_4_ = fVar138 * fVar136;
      fVar119 = auVar78._12_4_;
      auVar147._12_4_ = fVar119 * fVar137;
      auVar169._0_4_ = fVar139 * fVar225;
      auVar169._4_4_ = fVar197 * fVar241;
      auVar169._8_4_ = fVar138 * fVar225;
      auVar169._12_4_ = fVar119 * fVar241;
      auVar189._0_4_ = fVar139 * fVar264;
      auVar189._4_4_ = fVar197 * fVar275;
      auVar189._8_4_ = fVar138 * fVar264;
      auVar189._12_4_ = fVar119 * fVar275;
      auVar108._0_4_ = fVar139 * fVar327;
      auVar108._4_4_ = fVar197 * fVar337;
      auVar108._8_4_ = fVar138 * fVar327;
      auVar108._12_4_ = fVar119 * fVar337;
      auVar78 = vfmadd231ps_fma(auVar147,auVar79,auVar210);
      auVar96 = vfmadd231ps_fma(auVar169,auVar79,auVar250);
      auVar102 = vfmadd231ps_fma(auVar189,auVar79,auVar279);
      auVar79 = vfmadd231ps_fma(auVar108,auVar79,auVar318);
      auVar133._16_16_ = auVar78;
      auVar133._0_16_ = auVar78;
      auVar155._16_16_ = auVar96;
      auVar155._0_16_ = auVar96;
      auVar179._16_16_ = auVar102;
      auVar179._0_16_ = auVar102;
      auVar217._4_4_ = auVar217._0_4_;
      auVar217._8_4_ = auVar217._0_4_;
      auVar217._12_4_ = auVar217._0_4_;
      auVar217._20_4_ = fVar196;
      auVar217._16_4_ = fVar196;
      auVar217._24_4_ = fVar196;
      auVar217._28_4_ = fVar196;
      auVar91 = vsubps_avx(auVar155,auVar133);
      auVar96 = vfmadd213ps_fma(auVar91,auVar217,auVar133);
      auVar91 = vsubps_avx(auVar179,auVar155);
      auVar120 = vfmadd213ps_fma(auVar91,auVar217,auVar155);
      auVar78 = vsubps_avx(auVar79,auVar102);
      auVar156._16_16_ = auVar78;
      auVar156._0_16_ = auVar78;
      auVar78 = vfmadd213ps_fma(auVar156,auVar217,auVar179);
      auVar91 = vsubps_avx(ZEXT1632(auVar120),ZEXT1632(auVar96));
      auVar79 = vfmadd213ps_fma(auVar91,auVar217,ZEXT1632(auVar96));
      auVar91 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar120));
      auVar78 = vfmadd213ps_fma(auVar91,auVar217,ZEXT1632(auVar120));
      auVar91 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar79));
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar91,auVar217);
      fVar135 = auVar91._4_4_ * 3.0;
      fVar134 = fVar180 * 0.33333334;
      auVar280._0_8_ =
           CONCAT44(auVar160._4_4_ + fVar134 * fVar135,
                    auVar160._0_4_ + fVar134 * auVar91._0_4_ * 3.0);
      auVar280._8_4_ = auVar160._8_4_ + fVar134 * auVar91._8_4_ * 3.0;
      auVar280._12_4_ = auVar160._12_4_ + fVar134 * auVar91._12_4_ * 3.0;
      auVar79 = vshufpd_avx(auVar160,auVar160,3);
      auVar96 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar78 = vsubps_avx(auVar79,auVar160);
      auVar102 = vsubps_avx(auVar96,(undefined1  [16])0x0);
      auVar126._0_4_ = auVar78._0_4_ + auVar102._0_4_;
      auVar126._4_4_ = auVar78._4_4_ + auVar102._4_4_;
      auVar126._8_4_ = auVar78._8_4_ + auVar102._8_4_;
      auVar126._12_4_ = auVar78._12_4_ + auVar102._12_4_;
      auVar78 = vshufps_avx(auVar160,auVar160,0xb1);
      auVar102 = vshufps_avx(auVar280,auVar280,0xb1);
      auVar319._4_4_ = auVar126._0_4_;
      auVar319._0_4_ = auVar126._0_4_;
      auVar319._8_4_ = auVar126._0_4_;
      auVar319._12_4_ = auVar126._0_4_;
      auVar120 = vshufps_avx(auVar126,auVar126,0x55);
      fVar139 = auVar120._0_4_;
      auVar232._0_4_ = auVar78._0_4_ * fVar139;
      fVar197 = auVar120._4_4_;
      auVar232._4_4_ = auVar78._4_4_ * fVar197;
      fVar138 = auVar120._8_4_;
      auVar232._8_4_ = auVar78._8_4_ * fVar138;
      fVar119 = auVar120._12_4_;
      auVar232._12_4_ = auVar78._12_4_ * fVar119;
      auVar251._0_4_ = auVar102._0_4_ * fVar139;
      auVar251._4_4_ = auVar102._4_4_ * fVar197;
      auVar251._8_4_ = auVar102._8_4_ * fVar138;
      auVar251._12_4_ = auVar102._12_4_ * fVar119;
      auVar253 = vfmadd231ps_fma(auVar232,auVar319,auVar160);
      auVar121 = vfmadd231ps_fma(auVar251,auVar319,auVar280);
      auVar102 = vshufps_avx(auVar253,auVar253,0xe8);
      auVar120 = vshufps_avx(auVar121,auVar121,0xe8);
      auVar78 = vcmpps_avx(auVar102,auVar120,1);
      uVar66 = vextractps_avx(auVar78,0);
      auVar181 = auVar121;
      if ((uVar66 & 1) == 0) {
        auVar181 = auVar253;
      }
      auVar170._0_4_ = fVar134 * auVar91._16_4_ * 3.0;
      auVar170._4_4_ = fVar134 * fVar135;
      auVar170._8_4_ = fVar134 * auVar91._24_4_ * 3.0;
      auVar170._12_4_ = fVar134 * fVar196;
      auVar227 = vsubps_avx((undefined1  [16])0x0,auVar170);
      auVar171 = vshufps_avx(auVar227,auVar227,0xb1);
      auVar191 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar342._0_4_ = auVar171._0_4_ * fVar139;
      auVar342._4_4_ = auVar171._4_4_ * fVar197;
      auVar342._8_4_ = auVar171._8_4_ * fVar138;
      auVar342._12_4_ = auVar171._12_4_ * fVar119;
      auVar127._0_4_ = auVar191._0_4_ * fVar139;
      auVar127._4_4_ = auVar191._4_4_ * fVar197;
      auVar127._8_4_ = auVar191._8_4_ * fVar138;
      auVar127._12_4_ = auVar191._12_4_ * fVar119;
      auVar242 = vfmadd231ps_fma(auVar342,auVar319,auVar227);
      auVar243 = vfmadd231ps_fma(auVar127,(undefined1  [16])0x0,auVar319);
      auVar191 = vshufps_avx(auVar242,auVar242,0xe8);
      auVar226 = vshufps_avx(auVar243,auVar243,0xe8);
      auVar171 = vcmpps_avx(auVar191,auVar226,1);
      uVar66 = vextractps_avx(auVar171,0);
      auVar265 = auVar243;
      if ((uVar66 & 1) == 0) {
        auVar265 = auVar242;
      }
      auVar181 = vmaxss_avx(auVar265,auVar181);
      auVar102 = vminps_avx(auVar102,auVar120);
      auVar120 = vminps_avx(auVar191,auVar226);
      auVar120 = vminps_avx(auVar102,auVar120);
      auVar78 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vblendps_avx(auVar78,auVar171,2);
      auVar171 = vpslld_avx(auVar78,0x1f);
      auVar78 = vshufpd_avx(auVar121,auVar121,1);
      auVar78 = vinsertps_avx(auVar78,auVar243,0x9c);
      auVar102 = vshufpd_avx(auVar253,auVar253,1);
      auVar102 = vinsertps_avx(auVar102,auVar242,0x9c);
      auVar78 = vblendvps_avx(auVar102,auVar78,auVar171);
      auVar102 = vmovshdup_avx(auVar78);
      auVar78 = vmaxss_avx(auVar102,auVar78);
      fVar138 = auVar120._0_4_;
      auVar102 = vmovshdup_avx(auVar120);
      fVar197 = auVar78._0_4_;
      fVar139 = auVar181._0_4_;
      if ((0.0001 <= fVar138) || (fVar197 <= -0.0001)) {
        auVar253 = vcmpps_avx(auVar102,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar121 = vcmpps_avx(auVar120,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar253 = vorps_avx(auVar121,auVar253);
        if ((-0.0001 < fVar139 & auVar253[0]) != 0) goto LAB_01792bf5;
        auVar253 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar78,5);
        auVar121 = vcmpps_avx(auVar102,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar253 = vorps_avx(auVar121,auVar253);
        if ((auVar253 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01792bf5;
LAB_0179359f:
        bVar53 = true;
      }
      else {
LAB_01792bf5:
        auVar121 = vcmpps_avx(auVar120,_DAT_01feba10,1);
        auVar171 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar253 = vcmpss_avx(auVar181,ZEXT816(0) << 0x20,1);
        auVar190._8_4_ = 0x3f800000;
        auVar190._0_8_ = &DAT_3f8000003f800000;
        auVar190._12_4_ = 0x3f800000;
        auVar252._8_4_ = 0xbf800000;
        auVar252._0_8_ = 0xbf800000bf800000;
        auVar252._12_4_ = 0xbf800000;
        auVar253 = vblendvps_avx(auVar190,auVar252,auVar253);
        auVar121 = vblendvps_avx(auVar190,auVar252,auVar121);
        fVar119 = auVar121._0_4_;
        fVar134 = auVar253._0_4_;
        auVar253 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar119 == fVar134) && (!NAN(fVar119) && !NAN(fVar134))) {
          auVar253 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar191 = ZEXT816(0) << 0x20;
        if ((fVar119 == fVar134) && (!NAN(fVar119) && !NAN(fVar134))) {
          auVar171 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar121 = vmovshdup_avx(auVar121);
        fVar135 = auVar121._0_4_;
        if ((fVar119 != fVar135) || (NAN(fVar119) || NAN(fVar135))) {
          fVar119 = auVar102._0_4_;
          if ((fVar119 != fVar138) || (NAN(fVar119) || NAN(fVar138))) {
            auVar128._0_8_ = auVar120._0_8_ ^ 0x8000000080000000;
            auVar128._8_4_ = auVar120._8_4_ ^ 0x80000000;
            auVar128._12_4_ = auVar120._12_4_ ^ 0x80000000;
            auVar172._0_4_ = -fVar138 / (fVar119 - fVar138);
            auVar172._4_12_ = auVar128._4_12_;
            auVar102 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar172._0_4_)),auVar191,auVar172);
            auVar120 = auVar102;
          }
          else {
            auVar102 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar138 == 0.0) && (auVar102 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar138))) {
              auVar102 = ZEXT816(0);
            }
            auVar120 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar138 == 0.0) && (auVar120 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar138))) {
              auVar120 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar253 = vminss_avx(auVar253,auVar102);
          auVar171 = vmaxss_avx(auVar120,auVar171);
        }
        auVar78 = vcmpss_avx(auVar78,auVar191,1);
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = &DAT_3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar304._8_4_ = 0xbf800000;
        auVar304._0_8_ = 0xbf800000bf800000;
        auVar304._12_4_ = 0xbf800000;
        auVar78 = vblendvps_avx(auVar173,auVar304,auVar78);
        fVar138 = auVar78._0_4_;
        auVar78 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar134 != fVar138) || (NAN(fVar134) || NAN(fVar138))) {
          if ((fVar197 != fVar139) || (NAN(fVar197) || NAN(fVar139))) {
            auVar129._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
            auVar129._8_4_ = auVar181._8_4_ ^ 0x80000000;
            auVar129._12_4_ = auVar181._12_4_ ^ 0x80000000;
            auVar174._0_4_ = -fVar139 / (fVar197 - fVar139);
            auVar174._4_12_ = auVar129._4_12_;
            auVar102 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar174._0_4_)),auVar191,auVar174);
            auVar120 = auVar102;
          }
          else {
            auVar102 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar139 == 0.0) && (auVar102 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar139))) {
              auVar102 = ZEXT816(0);
            }
            auVar120 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar139 == 0.0) && (auVar120 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar139))) {
              auVar120 = auVar78;
            }
          }
          auVar253 = vminss_avx(auVar253,auVar102);
          auVar171 = vmaxss_avx(auVar120,auVar171);
        }
        if ((fVar135 != fVar138) || (NAN(fVar135) || NAN(fVar138))) {
          auVar253 = vminss_avx(auVar253,auVar78);
          auVar171 = vmaxss_avx(auVar78,auVar171);
        }
        auVar102 = vmaxss_avx(auVar191,auVar253);
        auVar120 = vminss_avx(auVar171,auVar78);
        bVar53 = true;
        if (auVar102._0_4_ <= auVar120._0_4_) {
          auVar102 = vmaxss_avx(auVar191,ZEXT416((uint)(auVar102._0_4_ + -0.1)));
          auVar78 = vminss_avx(ZEXT416((uint)(auVar120._0_4_ + 0.1)),auVar78);
          auVar109._0_8_ = auVar160._0_8_;
          auVar109._8_8_ = auVar109._0_8_;
          auVar254._8_8_ = auVar280._0_8_;
          auVar254._0_8_ = auVar280._0_8_;
          auVar270._8_8_ = auVar227._0_8_;
          auVar270._0_8_ = auVar227._0_8_;
          auVar120 = vshufpd_avx(auVar280,auVar280,3);
          auVar253 = vshufpd_avx(auVar227,auVar227,3);
          auVar121 = vshufps_avx(auVar102,auVar78,0);
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = &DAT_3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar160 = vsubps_avx(auVar148,auVar121);
          local_780._0_4_ = auVar79._0_4_;
          local_780._4_4_ = auVar79._4_4_;
          fStack_778 = auVar79._8_4_;
          fStack_774 = auVar79._12_4_;
          fVar139 = auVar121._0_4_;
          auVar149._0_4_ = fVar139 * (float)local_780._0_4_;
          fVar197 = auVar121._4_4_;
          auVar149._4_4_ = fVar197 * (float)local_780._4_4_;
          fVar138 = auVar121._8_4_;
          auVar149._8_4_ = fVar138 * fStack_778;
          fVar119 = auVar121._12_4_;
          auVar149._12_4_ = fVar119 * fStack_774;
          auVar175._0_4_ = auVar120._0_4_ * fVar139;
          auVar175._4_4_ = auVar120._4_4_ * fVar197;
          auVar175._8_4_ = auVar120._8_4_ * fVar138;
          auVar175._12_4_ = auVar120._12_4_ * fVar119;
          auVar192._0_4_ = auVar253._0_4_ * fVar139;
          auVar192._4_4_ = auVar253._4_4_ * fVar197;
          auVar192._8_4_ = auVar253._8_4_ * fVar138;
          auVar192._12_4_ = auVar253._12_4_ * fVar119;
          local_760._0_4_ = auVar96._0_4_;
          local_760._4_4_ = auVar96._4_4_;
          uStack_758._0_4_ = auVar96._8_4_;
          uStack_758._4_4_ = auVar96._12_4_;
          auVar211._0_4_ = fVar139 * (float)local_760._0_4_;
          auVar211._4_4_ = fVar197 * (float)local_760._4_4_;
          auVar211._8_4_ = fVar138 * (float)uStack_758;
          auVar211._12_4_ = fVar119 * uStack_758._4_4_;
          auVar120 = vfmadd231ps_fma(auVar149,auVar160,auVar109);
          auVar253 = vfmadd231ps_fma(auVar175,auVar160,auVar254);
          auVar121 = vfmadd231ps_fma(auVar192,auVar160,auVar270);
          auVar160 = vfmadd231ps_fma(auVar211,auVar160,ZEXT816(0));
          auVar79 = vmovshdup_avx(_local_7a0);
          auVar191 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar102._0_4_)),_local_7a0,
                                     ZEXT416((uint)(1.0 - auVar102._0_4_)));
          auVar226 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar78._0_4_)),_local_7a0,
                                     ZEXT416((uint)(1.0 - auVar78._0_4_)));
          fVar139 = 1.0 / fVar180;
          auVar78 = vsubps_avx(auVar253,auVar120);
          auVar233._0_4_ = auVar78._0_4_ * 3.0;
          auVar233._4_4_ = auVar78._4_4_ * 3.0;
          auVar233._8_4_ = auVar78._8_4_ * 3.0;
          auVar233._12_4_ = auVar78._12_4_ * 3.0;
          auVar78 = vsubps_avx(auVar121,auVar253);
          auVar255._0_4_ = auVar78._0_4_ * 3.0;
          auVar255._4_4_ = auVar78._4_4_ * 3.0;
          auVar255._8_4_ = auVar78._8_4_ * 3.0;
          auVar255._12_4_ = auVar78._12_4_ * 3.0;
          auVar78 = vsubps_avx(auVar160,auVar121);
          auVar271._0_4_ = auVar78._0_4_ * 3.0;
          auVar271._4_4_ = auVar78._4_4_ * 3.0;
          auVar271._8_4_ = auVar78._8_4_ * 3.0;
          auVar271._12_4_ = auVar78._12_4_ * 3.0;
          auVar79 = vminps_avx(auVar255,auVar271);
          auVar78 = vmaxps_avx(auVar255,auVar271);
          auVar79 = vminps_avx(auVar233,auVar79);
          auVar78 = vmaxps_avx(auVar233,auVar78);
          auVar96 = vshufpd_avx(auVar79,auVar79,3);
          auVar102 = vshufpd_avx(auVar78,auVar78,3);
          auVar79 = vminps_avx(auVar79,auVar96);
          auVar78 = vmaxps_avx(auVar78,auVar102);
          auVar256._0_4_ = auVar79._0_4_ * fVar139;
          auVar256._4_4_ = auVar79._4_4_ * fVar139;
          auVar256._8_4_ = auVar79._8_4_ * fVar139;
          auVar256._12_4_ = auVar79._12_4_ * fVar139;
          auVar234._0_4_ = fVar139 * auVar78._0_4_;
          auVar234._4_4_ = fVar139 * auVar78._4_4_;
          auVar234._8_4_ = fVar139 * auVar78._8_4_;
          auVar234._12_4_ = fVar139 * auVar78._12_4_;
          fVar139 = 1.0 / (auVar226._0_4_ - auVar191._0_4_);
          auVar78 = vshufpd_avx(auVar120,auVar120,3);
          auVar79 = vshufpd_avx(auVar253,auVar253,3);
          auVar96 = vshufpd_avx(auVar121,auVar121,3);
          auVar102 = vshufpd_avx(auVar160,auVar160,3);
          auVar78 = vsubps_avx(auVar78,auVar120);
          auVar120 = vsubps_avx(auVar79,auVar253);
          auVar253 = vsubps_avx(auVar96,auVar121);
          auVar102 = vsubps_avx(auVar102,auVar160);
          auVar79 = vminps_avx(auVar78,auVar120);
          auVar78 = vmaxps_avx(auVar78,auVar120);
          auVar96 = vminps_avx(auVar253,auVar102);
          auVar96 = vminps_avx(auVar79,auVar96);
          auVar79 = vmaxps_avx(auVar253,auVar102);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar296._0_4_ = fVar139 * auVar96._0_4_;
          auVar296._4_4_ = fVar139 * auVar96._4_4_;
          auVar296._8_4_ = fVar139 * auVar96._8_4_;
          auVar296._12_4_ = fVar139 * auVar96._12_4_;
          auVar281._0_4_ = fVar139 * auVar78._0_4_;
          auVar281._4_4_ = fVar139 * auVar78._4_4_;
          auVar281._8_4_ = fVar139 * auVar78._8_4_;
          auVar281._12_4_ = fVar139 * auVar78._12_4_;
          auVar102 = vinsertps_avx(auVar80,auVar191,0x10);
          auVar120 = vinsertps_avx(auVar81,auVar226,0x10);
          auVar89._0_4_ = (auVar102._0_4_ + auVar120._0_4_) * 0.5;
          auVar89._4_4_ = (auVar102._4_4_ + auVar120._4_4_) * 0.5;
          auVar89._8_4_ = (auVar102._8_4_ + auVar120._8_4_) * 0.5;
          auVar89._12_4_ = (auVar102._12_4_ + auVar120._12_4_) * 0.5;
          auVar150._4_4_ = auVar89._0_4_;
          auVar150._0_4_ = auVar89._0_4_;
          auVar150._8_4_ = auVar89._0_4_;
          auVar150._12_4_ = auVar89._0_4_;
          auVar78 = vfmadd213ps_fma(auVar15,auVar150,auVar18);
          auVar79 = vfmadd213ps_fma(auVar16,auVar150,auVar19);
          auVar96 = vfmadd213ps_fma(auVar17,auVar150,auVar20);
          auVar81 = vsubps_avx(auVar79,auVar78);
          auVar78 = vfmadd213ps_fma(auVar81,auVar150,auVar78);
          auVar81 = vsubps_avx(auVar96,auVar79);
          auVar81 = vfmadd213ps_fma(auVar81,auVar150,auVar79);
          auVar81 = vsubps_avx(auVar81,auVar78);
          auVar78 = vfmadd231ps_fma(auVar78,auVar81,auVar150);
          auVar151._0_8_ = CONCAT44(auVar81._4_4_ * 3.0,auVar81._0_4_ * 3.0);
          auVar151._8_4_ = auVar81._8_4_ * 3.0;
          auVar151._12_4_ = auVar81._12_4_ * 3.0;
          auVar272._8_8_ = auVar78._0_8_;
          auVar272._0_8_ = auVar78._0_8_;
          auVar81 = vshufpd_avx(auVar78,auVar78,3);
          auVar78 = vshufps_avx(auVar89,auVar89,0x55);
          auVar253 = vsubps_avx(auVar81,auVar272);
          auVar160 = vfmadd231ps_fma(auVar272,auVar78,auVar253);
          auVar320._8_8_ = auVar151._0_8_;
          auVar320._0_8_ = auVar151._0_8_;
          auVar81 = vshufpd_avx(auVar151,auVar151,3);
          auVar81 = vsubps_avx(auVar81,auVar320);
          auVar121 = vfmadd213ps_fma(auVar81,auVar78,auVar320);
          auVar78 = vmovshdup_avx(auVar121);
          auVar321._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
          auVar321._8_4_ = auVar78._8_4_ ^ 0x80000000;
          auVar321._12_4_ = auVar78._12_4_ ^ 0x80000000;
          auVar79 = vmovshdup_avx(auVar253);
          auVar81 = vunpcklps_avx(auVar79,auVar321);
          auVar96 = vshufps_avx(auVar81,auVar321,4);
          auVar343._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
          auVar343._8_4_ = auVar253._8_4_ ^ 0x80000000;
          auVar343._12_4_ = auVar253._12_4_ ^ 0x80000000;
          auVar81 = vmovlhps_avx(auVar343,auVar121);
          auVar81 = vshufps_avx(auVar81,auVar121,8);
          auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar253._0_4_)),auVar79,auVar121
                                   );
          auVar176._0_4_ = auVar78._0_4_;
          auVar176._4_4_ = auVar176._0_4_;
          auVar176._8_4_ = auVar176._0_4_;
          auVar176._12_4_ = auVar176._0_4_;
          auVar78 = vdivps_avx(auVar96,auVar176);
          auVar79 = vdivps_avx(auVar81,auVar176);
          fVar138 = auVar160._0_4_;
          fVar139 = auVar78._0_4_;
          auVar81 = vshufps_avx(auVar160,auVar160,0x55);
          fVar197 = auVar79._0_4_;
          local_760._4_4_ = fVar138 * auVar78._4_4_ + auVar81._4_4_ * auVar79._4_4_;
          local_760._0_4_ = fVar138 * fVar139 + auVar81._0_4_ * fVar197;
          uStack_758._0_4_ = fVar138 * auVar78._8_4_ + auVar81._8_4_ * auVar79._8_4_;
          uStack_758._4_4_ = fVar138 * auVar78._12_4_ + auVar81._12_4_ * auVar79._12_4_;
          auVar253 = vmovshdup_avx(auVar78);
          auVar81 = vinsertps_avx(auVar256,auVar296,0x1c);
          auVar333._0_4_ = auVar253._0_4_ * auVar81._0_4_;
          auVar333._4_4_ = auVar253._4_4_ * auVar81._4_4_;
          auVar333._8_4_ = auVar253._8_4_ * auVar81._8_4_;
          auVar333._12_4_ = auVar253._12_4_ * auVar81._12_4_;
          auVar96 = vinsertps_avx(auVar234,auVar281,0x1c);
          auVar305._0_4_ = auVar253._0_4_ * auVar96._0_4_;
          auVar305._4_4_ = auVar253._4_4_ * auVar96._4_4_;
          auVar305._8_4_ = auVar253._8_4_ * auVar96._8_4_;
          auVar305._12_4_ = auVar253._12_4_ * auVar96._12_4_;
          auVar181 = vminps_avx(auVar333,auVar305);
          auVar160 = vmaxps_avx(auVar305,auVar333);
          auVar253 = vinsertps_avx(auVar296,auVar256,0x4c);
          auVar171 = vmovshdup_avx(auVar79);
          auVar121 = vinsertps_avx(auVar281,auVar234,0x4c);
          auVar282._0_4_ = auVar171._0_4_ * auVar253._0_4_;
          auVar282._4_4_ = auVar171._4_4_ * auVar253._4_4_;
          auVar282._8_4_ = auVar171._8_4_ * auVar253._8_4_;
          auVar282._12_4_ = auVar171._12_4_ * auVar253._12_4_;
          auVar297._0_4_ = auVar171._0_4_ * auVar121._0_4_;
          auVar297._4_4_ = auVar171._4_4_ * auVar121._4_4_;
          auVar297._8_4_ = auVar171._8_4_ * auVar121._8_4_;
          auVar297._12_4_ = auVar171._12_4_ * auVar121._12_4_;
          auVar171 = vminps_avx(auVar282,auVar297);
          auVar110._0_4_ = auVar171._0_4_ + auVar181._0_4_;
          auVar110._4_4_ = auVar171._4_4_ + auVar181._4_4_;
          auVar110._8_4_ = auVar171._8_4_ + auVar181._8_4_;
          auVar110._12_4_ = auVar171._12_4_ + auVar181._12_4_;
          auVar181 = vmaxps_avx(auVar297,auVar282);
          auVar283._0_4_ = auVar160._0_4_ + auVar181._0_4_;
          auVar283._4_4_ = auVar160._4_4_ + auVar181._4_4_;
          auVar283._8_4_ = auVar160._8_4_ + auVar181._8_4_;
          auVar283._12_4_ = auVar160._12_4_ + auVar181._12_4_;
          auVar298._8_8_ = 0x3f80000000000000;
          auVar298._0_8_ = 0x3f80000000000000;
          auVar160 = vsubps_avx(auVar298,auVar283);
          auVar181 = vsubps_avx(auVar298,auVar110);
          auVar171 = vsubps_avx(auVar102,auVar89);
          auVar322._0_4_ = fVar139 * auVar81._0_4_;
          auVar322._4_4_ = fVar139 * auVar81._4_4_;
          auVar322._8_4_ = fVar139 * auVar81._8_4_;
          auVar322._12_4_ = fVar139 * auVar81._12_4_;
          auVar306._0_4_ = fVar139 * auVar96._0_4_;
          auVar306._4_4_ = fVar139 * auVar96._4_4_;
          auVar306._8_4_ = fVar139 * auVar96._8_4_;
          auVar306._12_4_ = fVar139 * auVar96._12_4_;
          auVar96 = vminps_avx(auVar322,auVar306);
          auVar81 = vmaxps_avx(auVar306,auVar322);
          auVar257._0_4_ = fVar197 * auVar253._0_4_;
          auVar257._4_4_ = fVar197 * auVar253._4_4_;
          auVar257._8_4_ = fVar197 * auVar253._8_4_;
          auVar257._12_4_ = fVar197 * auVar253._12_4_;
          auVar235._0_4_ = fVar197 * auVar121._0_4_;
          auVar235._4_4_ = fVar197 * auVar121._4_4_;
          auVar235._8_4_ = fVar197 * auVar121._8_4_;
          auVar235._12_4_ = fVar197 * auVar121._12_4_;
          auVar253 = vminps_avx(auVar257,auVar235);
          auVar323._0_4_ = auVar96._0_4_ + auVar253._0_4_;
          auVar323._4_4_ = auVar96._4_4_ + auVar253._4_4_;
          auVar323._8_4_ = auVar96._8_4_ + auVar253._8_4_;
          auVar323._12_4_ = auVar96._12_4_ + auVar253._12_4_;
          auVar253 = vsubps_avx(auVar120,auVar89);
          auVar96 = vmaxps_avx(auVar235,auVar257);
          fVar138 = auVar171._0_4_;
          auVar258._0_4_ = fVar138 * auVar160._0_4_;
          fVar119 = auVar171._4_4_;
          auVar258._4_4_ = fVar119 * auVar160._4_4_;
          fVar134 = auVar171._8_4_;
          auVar258._8_4_ = fVar134 * auVar160._8_4_;
          fVar135 = auVar171._12_4_;
          auVar258._12_4_ = fVar135 * auVar160._12_4_;
          auVar236._0_4_ = auVar81._0_4_ + auVar96._0_4_;
          auVar236._4_4_ = auVar81._4_4_ + auVar96._4_4_;
          auVar236._8_4_ = auVar81._8_4_ + auVar96._8_4_;
          auVar236._12_4_ = auVar81._12_4_ + auVar96._12_4_;
          auVar307._8_8_ = 0x3f800000;
          auVar307._0_8_ = 0x3f800000;
          auVar81 = vsubps_avx(auVar307,auVar236);
          auVar96 = vsubps_avx(auVar307,auVar323);
          auVar324._0_4_ = fVar138 * auVar181._0_4_;
          auVar324._4_4_ = fVar119 * auVar181._4_4_;
          auVar324._8_4_ = fVar134 * auVar181._8_4_;
          auVar324._12_4_ = fVar135 * auVar181._12_4_;
          fVar157 = auVar253._0_4_;
          auVar284._0_4_ = fVar157 * auVar160._0_4_;
          fVar158 = auVar253._4_4_;
          auVar284._4_4_ = fVar158 * auVar160._4_4_;
          fVar159 = auVar253._8_4_;
          auVar284._8_4_ = fVar159 * auVar160._8_4_;
          fVar276 = auVar253._12_4_;
          auVar284._12_4_ = fVar276 * auVar160._12_4_;
          auVar111._0_4_ = fVar157 * auVar181._0_4_;
          auVar111._4_4_ = fVar158 * auVar181._4_4_;
          auVar111._8_4_ = fVar159 * auVar181._8_4_;
          auVar111._12_4_ = fVar276 * auVar181._12_4_;
          auVar344._0_4_ = fVar138 * auVar81._0_4_;
          auVar344._4_4_ = fVar119 * auVar81._4_4_;
          auVar344._8_4_ = fVar134 * auVar81._8_4_;
          auVar344._12_4_ = fVar135 * auVar81._12_4_;
          auVar299._0_4_ = fVar138 * auVar96._0_4_;
          auVar299._4_4_ = fVar119 * auVar96._4_4_;
          auVar299._8_4_ = fVar134 * auVar96._8_4_;
          auVar299._12_4_ = fVar135 * auVar96._12_4_;
          auVar237._0_4_ = fVar157 * auVar81._0_4_;
          auVar237._4_4_ = fVar158 * auVar81._4_4_;
          auVar237._8_4_ = fVar159 * auVar81._8_4_;
          auVar237._12_4_ = fVar276 * auVar81._12_4_;
          auVar308._0_4_ = fVar157 * auVar96._0_4_;
          auVar308._4_4_ = fVar158 * auVar96._4_4_;
          auVar308._8_4_ = fVar159 * auVar96._8_4_;
          auVar308._12_4_ = fVar276 * auVar96._12_4_;
          auVar81 = vminps_avx(auVar344,auVar299);
          auVar96 = vminps_avx(auVar237,auVar308);
          auVar81 = vminps_avx(auVar81,auVar96);
          auVar96 = vmaxps_avx(auVar299,auVar344);
          auVar253 = vminps_avx(auVar258,auVar324);
          auVar121 = vminps_avx(auVar284,auVar111);
          auVar253 = vminps_avx(auVar253,auVar121);
          auVar81 = vhaddps_avx(auVar81,auVar253);
          auVar253 = vmaxps_avx(auVar308,auVar237);
          auVar96 = vmaxps_avx(auVar253,auVar96);
          auVar253 = vmaxps_avx(auVar324,auVar258);
          auVar121 = vmaxps_avx(auVar111,auVar284);
          auVar253 = vmaxps_avx(auVar121,auVar253);
          auVar96 = vhaddps_avx(auVar96,auVar253);
          auVar253 = vshufps_avx(auVar89,auVar89,0x54);
          auVar253 = vsubps_avx(auVar253,_local_760);
          auVar81 = vshufps_avx(auVar81,auVar81,0xe8);
          auVar96 = vshufps_avx(auVar96,auVar96,0xe8);
          auVar259._0_4_ = auVar253._0_4_ + auVar81._0_4_;
          auVar259._4_4_ = auVar253._4_4_ + auVar81._4_4_;
          auVar259._8_4_ = auVar253._8_4_ + auVar81._8_4_;
          auVar259._12_4_ = auVar253._12_4_ + auVar81._12_4_;
          auVar238._0_4_ = auVar253._0_4_ + auVar96._0_4_;
          auVar238._4_4_ = auVar253._4_4_ + auVar96._4_4_;
          auVar238._8_4_ = auVar253._8_4_ + auVar96._8_4_;
          auVar238._12_4_ = auVar253._12_4_ + auVar96._12_4_;
          auVar81 = vmaxps_avx(auVar102,auVar259);
          auVar96 = vminps_avx(auVar238,auVar120);
          auVar81 = vcmpps_avx(auVar96,auVar81,1);
          auVar81 = vshufps_avx(auVar81,auVar81,0x50);
          _local_7a0 = vinsertps_avx(auVar191,ZEXT416((uint)auVar226._0_4_),0x10);
          if ((auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar81[0xf] < '\0') goto LAB_0179359f;
          bVar72 = 0;
          if ((auVar217._0_4_ < auVar259._0_4_) && (bVar72 = 0, auVar238._0_4_ < auVar120._0_4_)) {
            auVar96 = vmovshdup_avx(auVar259);
            auVar81 = vcmpps_avx(auVar238,auVar120,1);
            bVar72 = auVar81[4] & auVar191._0_4_ < auVar96._0_4_;
          }
          if (((3 < (uint)uVar69 || fVar180 < 0.001) | bVar72) == 1) {
            lVar71 = 200;
            do {
              fVar134 = auVar253._0_4_;
              fVar119 = 1.0 - fVar134;
              fVar180 = fVar119 * fVar119 * fVar119;
              fVar138 = fVar134 * 3.0 * fVar119 * fVar119;
              fVar119 = fVar119 * fVar134 * fVar134 * 3.0;
              auVar193._4_4_ = fVar180;
              auVar193._0_4_ = fVar180;
              auVar193._8_4_ = fVar180;
              auVar193._12_4_ = fVar180;
              auVar130._4_4_ = fVar138;
              auVar130._0_4_ = fVar138;
              auVar130._8_4_ = fVar138;
              auVar130._12_4_ = fVar138;
              auVar112._4_4_ = fVar119;
              auVar112._0_4_ = fVar119;
              auVar112._8_4_ = fVar119;
              auVar112._12_4_ = fVar119;
              fVar134 = fVar134 * fVar134 * fVar134;
              auVar212._0_4_ = (float)local_4c0._0_4_ * fVar134;
              auVar212._4_4_ = (float)local_4c0._4_4_ * fVar134;
              auVar212._8_4_ = fStack_4b8 * fVar134;
              auVar212._12_4_ = fStack_4b4 * fVar134;
              auVar81 = vfmadd231ps_fma(auVar212,auVar20,auVar112);
              auVar81 = vfmadd231ps_fma(auVar81,auVar19,auVar130);
              auVar81 = vfmadd231ps_fma(auVar81,auVar18,auVar193);
              auVar113._8_8_ = auVar81._0_8_;
              auVar113._0_8_ = auVar81._0_8_;
              auVar81 = vshufpd_avx(auVar81,auVar81,3);
              auVar96 = vshufps_avx(auVar253,auVar253,0x55);
              auVar81 = vsubps_avx(auVar81,auVar113);
              auVar96 = vfmadd213ps_fma(auVar81,auVar96,auVar113);
              fVar180 = auVar96._0_4_;
              auVar81 = vshufps_avx(auVar96,auVar96,0x55);
              auVar114._0_4_ = fVar139 * fVar180 + fVar197 * auVar81._0_4_;
              auVar114._4_4_ = auVar78._4_4_ * fVar180 + auVar79._4_4_ * auVar81._4_4_;
              auVar114._8_4_ = auVar78._8_4_ * fVar180 + auVar79._8_4_ * auVar81._8_4_;
              auVar114._12_4_ = auVar78._12_4_ * fVar180 + auVar79._12_4_ * auVar81._12_4_;
              auVar253 = vsubps_avx(auVar253,auVar114);
              auVar81 = vandps_avx(auVar338,auVar96);
              auVar96 = vshufps_avx(auVar81,auVar81,0xf5);
              auVar81 = vmaxss_avx(auVar96,auVar81);
              if (auVar81._0_4_ < (float)local_3b0._0_4_) {
                local_120 = auVar253._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar81 = vmovshdup_avx(auVar253);
                  fVar180 = auVar81._0_4_;
                  if ((0.0 <= fVar180) && (fVar180 <= 1.0)) {
                    auVar78 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar181 = vinsertps_avx(auVar78,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar78 = vdpps_avx(auVar181,local_4d0,0x7f);
                    auVar79 = vdpps_avx(auVar181,local_4e0,0x7f);
                    auVar96 = vdpps_avx(auVar181,local_3c0,0x7f);
                    auVar102 = vdpps_avx(auVar181,local_3d0,0x7f);
                    auVar120 = vdpps_avx(auVar181,local_3e0,0x7f);
                    auVar121 = vdpps_avx(auVar181,local_3f0,0x7f);
                    auVar160 = vdpps_avx(auVar181,local_400,0x7f);
                    auVar181 = vdpps_avx(auVar181,local_410,0x7f);
                    fVar139 = 1.0 - fVar180;
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * auVar120._0_4_)),
                                              ZEXT416((uint)fVar139),auVar78);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar121._0_4_ * fVar180)),
                                              ZEXT416((uint)fVar139),auVar79);
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar160._0_4_ * fVar180)),
                                              ZEXT416((uint)fVar139),auVar96);
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * auVar181._0_4_)),
                                               ZEXT416((uint)fVar139),auVar102);
                    fVar119 = 1.0 - local_120;
                    fVar139 = fVar119 * local_120 * local_120 * 3.0;
                    fVar135 = local_120 * local_120 * local_120;
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * auVar102._0_4_)),
                                              ZEXT416((uint)fVar139),auVar96);
                    fVar197 = local_120 * 3.0 * fVar119 * fVar119;
                    auVar79 = vfmadd231ss_fma(auVar96,ZEXT416((uint)fVar197),auVar79);
                    fVar138 = fVar119 * fVar119 * fVar119;
                    auVar78 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar138),auVar78);
                    auVar91 = ZEXT1632(auVar78);
                    fVar134 = auVar78._0_4_;
                    if (((fVar76 <= fVar134) &&
                        (fVar157 = *(float *)(ray + k * 4 + 0x100), fVar134 <= fVar157)) &&
                       (pGVar8 = (context->scene->geometries).items[uVar68].ptr,
                       (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar79 = vshufps_avx(auVar253,auVar253,0x55);
                      auVar273._8_4_ = 0x3f800000;
                      auVar273._0_8_ = &DAT_3f8000003f800000;
                      auVar273._12_4_ = 0x3f800000;
                      auVar96 = vsubps_avx(auVar273,auVar79);
                      fVar158 = auVar79._0_4_;
                      auVar285._0_4_ = fVar158 * (float)local_510._0_4_;
                      fVar159 = auVar79._4_4_;
                      auVar285._4_4_ = fVar159 * (float)local_510._4_4_;
                      fVar276 = auVar79._8_4_;
                      auVar285._8_4_ = fVar276 * fStack_508;
                      fVar199 = auVar79._12_4_;
                      auVar285._12_4_ = fVar199 * fStack_504;
                      auVar300._0_4_ = fVar158 * (float)local_520._0_4_;
                      auVar300._4_4_ = fVar159 * (float)local_520._4_4_;
                      auVar300._8_4_ = fVar276 * fStack_518;
                      auVar300._12_4_ = fVar199 * fStack_514;
                      local_5e0 = auVar22._0_4_;
                      fStack_5dc = auVar22._4_4_;
                      fStack_5d8 = auVar22._8_4_;
                      fStack_5d4 = auVar22._12_4_;
                      auVar309._0_4_ = fVar158 * local_5e0;
                      auVar309._4_4_ = fVar159 * fStack_5dc;
                      auVar309._8_4_ = fVar276 * fStack_5d8;
                      auVar309._12_4_ = fVar199 * fStack_5d4;
                      local_5f0 = auVar23._0_4_;
                      fStack_5ec = auVar23._4_4_;
                      fStack_5e8 = auVar23._8_4_;
                      fStack_5e4 = auVar23._12_4_;
                      auVar260._0_4_ = fVar158 * local_5f0;
                      auVar260._4_4_ = fVar159 * fStack_5ec;
                      auVar260._8_4_ = fVar276 * fStack_5e8;
                      auVar260._12_4_ = fVar199 * fStack_5e4;
                      auVar79 = vfmadd231ps_fma(auVar285,auVar96,local_4f0);
                      auVar102 = vfmadd231ps_fma(auVar300,auVar96,auVar21);
                      auVar120 = vfmadd231ps_fma(auVar309,auVar96,local_500);
                      auVar253 = vfmadd231ps_fma(auVar260,auVar96,auVar161);
                      auVar79 = vsubps_avx(auVar102,auVar79);
                      auVar96 = vsubps_avx(auVar120,auVar102);
                      auVar102 = vsubps_avx(auVar253,auVar120);
                      auVar310._0_4_ = local_120 * auVar96._0_4_;
                      auVar310._4_4_ = local_120 * auVar96._4_4_;
                      auVar310._8_4_ = local_120 * auVar96._8_4_;
                      auVar310._12_4_ = local_120 * auVar96._12_4_;
                      auVar239._4_4_ = fVar119;
                      auVar239._0_4_ = fVar119;
                      auVar239._8_4_ = fVar119;
                      auVar239._12_4_ = fVar119;
                      auVar79 = vfmadd231ps_fma(auVar310,auVar239,auVar79);
                      auVar261._0_4_ = local_120 * auVar102._0_4_;
                      auVar261._4_4_ = local_120 * auVar102._4_4_;
                      auVar261._8_4_ = local_120 * auVar102._8_4_;
                      auVar261._12_4_ = local_120 * auVar102._12_4_;
                      auVar96 = vfmadd231ps_fma(auVar261,auVar239,auVar96);
                      auVar262._0_4_ = local_120 * auVar96._0_4_;
                      auVar262._4_4_ = local_120 * auVar96._4_4_;
                      auVar262._8_4_ = local_120 * auVar96._8_4_;
                      auVar262._12_4_ = local_120 * auVar96._12_4_;
                      auVar96 = vfmadd231ps_fma(auVar262,auVar239,auVar79);
                      auVar213._0_4_ = fVar135 * (float)local_460._0_4_;
                      auVar213._4_4_ = fVar135 * (float)local_460._4_4_;
                      auVar213._8_4_ = fVar135 * fStack_458;
                      auVar213._12_4_ = fVar135 * fStack_454;
                      auVar152._4_4_ = fVar139;
                      auVar152._0_4_ = fVar139;
                      auVar152._8_4_ = fVar139;
                      auVar152._12_4_ = fVar139;
                      auVar79 = vfmadd132ps_fma(auVar152,auVar213,local_450);
                      auVar194._4_4_ = fVar197;
                      auVar194._0_4_ = fVar197;
                      auVar194._8_4_ = fVar197;
                      auVar194._12_4_ = fVar197;
                      auVar79 = vfmadd132ps_fma(auVar194,auVar79,local_440);
                      auVar214._0_4_ = auVar96._0_4_ * 3.0;
                      auVar214._4_4_ = auVar96._4_4_ * 3.0;
                      auVar214._8_4_ = auVar96._8_4_ * 3.0;
                      auVar214._12_4_ = auVar96._12_4_ * 3.0;
                      auVar177._4_4_ = fVar138;
                      auVar177._0_4_ = fVar138;
                      auVar177._8_4_ = fVar138;
                      auVar177._12_4_ = fVar138;
                      auVar96 = vfmadd132ps_fma(auVar177,auVar79,local_430);
                      auVar79 = vshufps_avx(auVar214,auVar214,0xc9);
                      auVar153._0_4_ = auVar96._0_4_ * auVar79._0_4_;
                      auVar153._4_4_ = auVar96._4_4_ * auVar79._4_4_;
                      auVar153._8_4_ = auVar96._8_4_ * auVar79._8_4_;
                      auVar153._12_4_ = auVar96._12_4_ * auVar79._12_4_;
                      auVar79 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar79 = vfmsub231ps_fma(auVar153,auVar214,auVar79);
                      local_140 = auVar79._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar134;
                        uVar77 = vextractps_avx(auVar79,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar77;
                        uVar77 = vextractps_avx(auVar79,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar77;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar180;
                        *(uint *)(ray + k * 4 + 0x220) = uVar7;
                        *(uint *)(ray + k * 4 + 0x240) = uVar68;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100._0_8_ = auVar81._0_8_;
                        local_100._8_8_ = local_100._0_8_;
                        local_100._16_8_ = local_100._0_8_;
                        local_100._24_8_ = local_100._0_8_;
                        auVar81 = vmovshdup_avx(auVar79);
                        local_180 = auVar81._0_8_;
                        auVar81 = vshufps_avx(auVar79,auVar79,0xaa);
                        local_160 = auVar81._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = CONCAT44(uStack_33c,local_340);
                        uStack_d8 = CONCAT44(uStack_334,uStack_338);
                        uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_c8 = CONCAT44(uStack_324,uStack_328);
                        local_c0 = CONCAT44(uStack_31c,local_320);
                        uStack_b8 = CONCAT44(uStack_314,uStack_318);
                        uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                        uStack_a8 = CONCAT44(uStack_304,uStack_308);
                        auVar26 = vpcmpeqd_avx2(local_100,local_100);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar134;
                        local_4a0 = local_360._0_8_;
                        uStack_498 = local_360._8_8_;
                        uStack_490 = local_360._16_8_;
                        uStack_488 = local_360._24_8_;
                        local_550.valid = (int *)&local_4a0;
                        local_550.geometryUserPtr = pGVar8->userPtr;
                        local_550.context = context->user;
                        local_550.hit = (RTCHitN *)&local_180;
                        local_550.N = 8;
                        local_550.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar91 = ZEXT1632(auVar78);
                          (*pGVar8->intersectionFilterN)(&local_550);
                          auVar118._8_56_ = extraout_var;
                          auVar118._0_8_ = extraout_XMM1_Qa;
                          auVar26 = vpcmpeqd_avx2(auVar118._0_32_,auVar118._0_32_);
                        }
                        auVar57._8_8_ = uStack_498;
                        auVar57._0_8_ = local_4a0;
                        auVar57._16_8_ = uStack_490;
                        auVar57._24_8_ = uStack_488;
                        auVar93 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar57);
                        auVar92 = auVar26 & ~auVar93;
                        if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar92 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar92 >> 0x7f,0) == '\0') &&
                              (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar92 >> 0xbf,0) == '\0') &&
                            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar92[0x1f]) {
                          auVar93 = auVar93 ^ auVar26;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar91 = ZEXT1632(auVar91._0_16_);
                            (*p_Var14)(&local_550);
                          }
                          auVar58._8_8_ = uStack_498;
                          auVar58._0_8_ = local_4a0;
                          auVar58._16_8_ = uStack_490;
                          auVar58._24_8_ = uStack_488;
                          auVar26 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar58
                                                 );
                          auVar92 = vpcmpeqd_avx2(auVar91,auVar91);
                          auVar93 = auVar26 ^ auVar92;
                          auVar91 = auVar92 & ~auVar26;
                          if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar91 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar91 >> 0x7f,0) != '\0') ||
                                (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar91 >> 0xbf,0) != '\0') ||
                              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar91[0x1f] < '\0') {
                            auVar117._0_4_ = auVar26._0_4_ ^ auVar92._0_4_;
                            auVar117._4_4_ = auVar26._4_4_ ^ auVar92._4_4_;
                            auVar117._8_4_ = auVar26._8_4_ ^ auVar92._8_4_;
                            auVar117._12_4_ = auVar26._12_4_ ^ auVar92._12_4_;
                            auVar117._16_4_ = auVar26._16_4_ ^ auVar92._16_4_;
                            auVar117._20_4_ = auVar26._20_4_ ^ auVar92._20_4_;
                            auVar117._24_4_ = auVar26._24_4_ ^ auVar92._24_4_;
                            auVar117._28_4_ = auVar26._28_4_ ^ auVar92._28_4_;
                            auVar91 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_550.hit);
                            *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar91;
                            auVar91 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                               (local_550.hit + 0x20));
                            *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar91;
                            auVar91 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                               (local_550.hit + 0x40));
                            *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar91;
                            auVar91 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                               (local_550.hit + 0x60));
                            *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar91;
                            auVar91 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                               (local_550.hit + 0x80));
                            *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar91;
                            auVar91 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                                (local_550.hit + 0xa0));
                            *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar91;
                            auVar91 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                                (local_550.hit + 0xc0));
                            *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar91;
                            auVar91 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                                (local_550.hit + 0xe0));
                            *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar91;
                            auVar91 = vpmaskmovd_avx2(auVar117,*(undefined1 (*) [32])
                                                                (local_550.hit + 0x100));
                            *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar91;
                          }
                        }
                        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar93 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar93 >> 0x7f,0) == '\0') &&
                              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar93 >> 0xbf,0) == '\0') &&
                            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar93[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar157;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar71 = lVar71 + -1;
            } while (lVar71 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    local_420 = vinsertps_avx(auVar80,ZEXT416((uint)fVar196),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }